

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  uint uVar9;
  undefined4 uVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  ulong uVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  byte bVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar72;
  int iVar73;
  ulong uVar74;
  uint uVar75;
  long lVar76;
  Geometry *pGVar77;
  ulong uVar78;
  byte bVar79;
  float fVar80;
  float fVar81;
  float fVar135;
  float fVar137;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar91 [16];
  float fVar136;
  float fVar138;
  float fVar140;
  float fVar141;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar139;
  float fVar142;
  float fVar143;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined4 uVar144;
  float fVar159;
  float fVar160;
  vint4 bi_2;
  float fVar161;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  vint4 bi_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  float fVar165;
  vint4 bi;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar186;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  vint4 ai_2;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  vint4 ai;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [64];
  vint4 ai_1;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar221 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  RTCFilterFunctionNArguments args;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  RTCFilterFunctionNArguments local_678;
  undefined1 (*local_648) [32];
  undefined1 local_640 [32];
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined8 local_5a0;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined4 local_340;
  int local_33c;
  undefined1 local_330 [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar222 [32];
  
  PVar8 = prim[1];
  uVar74 = (ulong)(byte)PVar8;
  fVar165 = *(float *)(prim + uVar74 * 0x19 + 0x12);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar82 = vsubps_avx(auVar82,*(undefined1 (*) [16])(prim + uVar74 * 0x19 + 6));
  auVar175._0_4_ = fVar165 * auVar82._0_4_;
  auVar175._4_4_ = fVar165 * auVar82._4_4_;
  auVar175._8_4_ = fVar165 * auVar82._8_4_;
  auVar175._12_4_ = fVar165 * auVar82._12_4_;
  auVar86._0_4_ = fVar165 * auVar83._0_4_;
  auVar86._4_4_ = fVar165 * auVar83._4_4_;
  auVar86._8_4_ = fVar165 * auVar83._8_4_;
  auVar86._12_4_ = fVar165 * auVar83._12_4_;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 4 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 5 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xb + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar74 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  uVar78 = (ulong)(uint)((int)(uVar74 * 9) * 2);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + uVar74 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  uVar70 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar218._4_4_ = auVar86._0_4_;
  auVar218._0_4_ = auVar86._0_4_;
  auVar218._8_4_ = auVar86._0_4_;
  auVar218._12_4_ = auVar86._0_4_;
  auVar89 = vshufps_avx(auVar86,auVar86,0x55);
  auVar85 = vshufps_avx(auVar86,auVar86,0xaa);
  fVar165 = auVar85._0_4_;
  auVar91._0_4_ = fVar165 * auVar90._0_4_;
  fVar159 = auVar85._4_4_;
  auVar91._4_4_ = fVar159 * auVar90._4_4_;
  fVar160 = auVar85._8_4_;
  auVar91._8_4_ = fVar160 * auVar90._8_4_;
  fVar161 = auVar85._12_4_;
  auVar91._12_4_ = fVar161 * auVar90._12_4_;
  auVar87._0_4_ = auVar21._0_4_ * fVar165;
  auVar87._4_4_ = auVar21._4_4_ * fVar159;
  auVar87._8_4_ = auVar21._8_4_ * fVar160;
  auVar87._12_4_ = auVar21._12_4_ * fVar161;
  auVar145._0_4_ = auVar24._0_4_ * fVar165;
  auVar145._4_4_ = auVar24._4_4_ * fVar159;
  auVar145._8_4_ = auVar24._8_4_ * fVar160;
  auVar145._12_4_ = auVar24._12_4_ * fVar161;
  auVar85 = vfmadd231ps_fma(auVar91,auVar89,auVar83);
  auVar84 = vfmadd231ps_fma(auVar87,auVar89,auVar20);
  auVar89 = vfmadd231ps_fma(auVar145,auVar23,auVar89);
  auVar88 = vfmadd231ps_fma(auVar85,auVar218,auVar82);
  auVar84 = vfmadd231ps_fma(auVar84,auVar218,auVar19);
  auVar86 = vfmadd231ps_fma(auVar89,auVar22,auVar218);
  auVar219._4_4_ = auVar175._0_4_;
  auVar219._0_4_ = auVar175._0_4_;
  auVar219._8_4_ = auVar175._0_4_;
  auVar219._12_4_ = auVar175._0_4_;
  auVar89 = vshufps_avx(auVar175,auVar175,0x55);
  auVar85 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar165 = auVar85._0_4_;
  auVar220._0_4_ = fVar165 * auVar90._0_4_;
  fVar159 = auVar85._4_4_;
  auVar220._4_4_ = fVar159 * auVar90._4_4_;
  fVar160 = auVar85._8_4_;
  auVar220._8_4_ = fVar160 * auVar90._8_4_;
  fVar161 = auVar85._12_4_;
  auVar220._12_4_ = fVar161 * auVar90._12_4_;
  auVar187._0_4_ = auVar21._0_4_ * fVar165;
  auVar187._4_4_ = auVar21._4_4_ * fVar159;
  auVar187._8_4_ = auVar21._8_4_ * fVar160;
  auVar187._12_4_ = auVar21._12_4_ * fVar161;
  auVar176._0_4_ = auVar24._0_4_ * fVar165;
  auVar176._4_4_ = auVar24._4_4_ * fVar159;
  auVar176._8_4_ = auVar24._8_4_ * fVar160;
  auVar176._12_4_ = auVar24._12_4_ * fVar161;
  auVar83 = vfmadd231ps_fma(auVar220,auVar89,auVar83);
  auVar90 = vfmadd231ps_fma(auVar187,auVar89,auVar20);
  auVar20 = vfmadd231ps_fma(auVar176,auVar89,auVar23);
  auVar21 = vfmadd231ps_fma(auVar83,auVar219,auVar82);
  auVar23 = vfmadd231ps_fma(auVar90,auVar219,auVar19);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar227 = ZEXT1664(auVar82);
  auVar24 = vfmadd231ps_fma(auVar20,auVar219,auVar22);
  auVar83 = vandps_avx512vl(auVar88,auVar82);
  auVar205._8_4_ = 0x219392ef;
  auVar205._0_8_ = 0x219392ef219392ef;
  auVar205._12_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar83,auVar205,1);
  bVar12 = (bool)((byte)uVar78 & 1);
  auVar85._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._0_4_;
  bVar12 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._4_4_;
  bVar12 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._8_4_;
  bVar12 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._12_4_;
  auVar83 = vandps_avx512vl(auVar84,auVar82);
  uVar78 = vcmpps_avx512vl(auVar83,auVar205,1);
  bVar12 = (bool)((byte)uVar78 & 1);
  auVar88._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._0_4_;
  bVar12 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._4_4_;
  bVar12 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._8_4_;
  bVar12 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._12_4_;
  auVar82 = vandps_avx512vl(auVar86,auVar82);
  uVar78 = vcmpps_avx512vl(auVar82,auVar205,1);
  bVar12 = (bool)((byte)uVar78 & 1);
  auVar84._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar86._0_4_;
  bVar12 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar86._4_4_;
  bVar12 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar86._8_4_;
  bVar12 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar86._12_4_;
  auVar83 = vrcp14ps_avx512vl(auVar85);
  auVar206._8_4_ = 0x3f800000;
  auVar206._0_8_ = 0x3f8000003f800000;
  auVar206._12_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar85,auVar83,auVar206);
  auVar19 = vfmadd132ps_fma(auVar82,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar88);
  auVar82 = vfnmadd213ps_fma(auVar88,auVar83,auVar206);
  auVar20 = vfmadd132ps_fma(auVar82,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar84);
  auVar82 = vfnmadd213ps_fma(auVar84,auVar83,auVar206);
  auVar22 = vfmadd132ps_fma(auVar82,auVar83,auVar83);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar74 * 7 + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar21);
  auVar195._0_4_ = auVar19._0_4_ * auVar82._0_4_;
  auVar195._4_4_ = auVar19._4_4_ * auVar82._4_4_;
  auVar195._8_4_ = auVar19._8_4_ * auVar82._8_4_;
  auVar195._12_4_ = auVar19._12_4_ * auVar82._12_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar74 * 9 + 6);
  auVar82 = vpmovsxwd_avx(auVar83);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar21);
  auVar85 = vpbroadcastd_avx512vl();
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar83 = vpmovsxwd_avx(auVar90);
  auVar166._0_4_ = auVar19._0_4_ * auVar82._0_4_;
  auVar166._4_4_ = auVar19._4_4_ * auVar82._4_4_;
  auVar166._8_4_ = auVar19._8_4_ * auVar82._8_4_;
  auVar166._12_4_ = auVar19._12_4_ * auVar82._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar74 * -2 + 6);
  auVar82 = vpmovsxwd_avx(auVar19);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar23);
  auVar207._0_4_ = auVar20._0_4_ * auVar82._0_4_;
  auVar207._4_4_ = auVar20._4_4_ * auVar82._4_4_;
  auVar207._8_4_ = auVar20._8_4_ * auVar82._8_4_;
  auVar207._12_4_ = auVar20._12_4_ * auVar82._12_4_;
  auVar82 = vcvtdq2ps_avx(auVar83);
  auVar82 = vsubps_avx(auVar82,auVar23);
  auVar162._0_4_ = auVar20._0_4_ * auVar82._0_4_;
  auVar162._4_4_ = auVar20._4_4_ * auVar82._4_4_;
  auVar162._8_4_ = auVar20._8_4_ * auVar82._8_4_;
  auVar162._12_4_ = auVar20._12_4_ * auVar82._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar70 + uVar74 + 6);
  auVar82 = vpmovsxwd_avx(auVar20);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar24);
  auVar188._0_4_ = auVar22._0_4_ * auVar82._0_4_;
  auVar188._4_4_ = auVar22._4_4_ * auVar82._4_4_;
  auVar188._8_4_ = auVar22._8_4_ * auVar82._8_4_;
  auVar188._12_4_ = auVar22._12_4_ * auVar82._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar74 * 0x17 + 6);
  auVar82 = vpmovsxwd_avx(auVar21);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar24);
  auVar146._0_4_ = auVar22._0_4_ * auVar82._0_4_;
  auVar146._4_4_ = auVar22._4_4_ * auVar82._4_4_;
  auVar146._8_4_ = auVar22._8_4_ * auVar82._8_4_;
  auVar146._12_4_ = auVar22._12_4_ * auVar82._12_4_;
  auVar82 = vpminsd_avx(auVar195,auVar166);
  auVar83 = vpminsd_avx(auVar207,auVar162);
  auVar82 = vmaxps_avx(auVar82,auVar83);
  auVar83 = vpminsd_avx(auVar188,auVar146);
  uVar144 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar22._4_4_ = uVar144;
  auVar22._0_4_ = uVar144;
  auVar22._8_4_ = uVar144;
  auVar22._12_4_ = uVar144;
  auVar83 = vmaxps_avx512vl(auVar83,auVar22);
  auVar82 = vmaxps_avx(auVar82,auVar83);
  auVar23._8_4_ = 0x3f7ffffa;
  auVar23._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar23._12_4_ = 0x3f7ffffa;
  local_270 = vmulps_avx512vl(auVar82,auVar23);
  auVar82 = vpmaxsd_avx(auVar195,auVar166);
  auVar83 = vpmaxsd_avx(auVar207,auVar162);
  auVar82 = vminps_avx(auVar82,auVar83);
  auVar83 = vpmaxsd_avx(auVar188,auVar146);
  uVar144 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar24._4_4_ = uVar144;
  auVar24._0_4_ = uVar144;
  auVar24._8_4_ = uVar144;
  auVar24._12_4_ = uVar144;
  auVar83 = vminps_avx512vl(auVar83,auVar24);
  auVar82 = vminps_avx(auVar82,auVar83);
  auVar89._8_4_ = 0x3f800003;
  auVar89._0_8_ = 0x3f8000033f800003;
  auVar89._12_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar89);
  uVar25 = vcmpps_avx512vl(local_270,auVar82,2);
  uVar78 = vpcmpgtd_avx512vl(auVar85,_DAT_01f7fcf0);
  uVar78 = ((byte)uVar25 & 0xf) & uVar78;
  if ((char)uVar78 != '\0') {
    local_648 = (undefined1 (*) [32])&local_140;
    local_260 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar29 = 0;
      for (uVar70 = uVar78; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar75 = *(uint *)(prim + 2);
      uVar9 = *(uint *)(prim + lVar29 * 4 + 6);
      pGVar77 = (context->scene->geometries).items[uVar75].ptr;
      uVar70 = (ulong)*(uint *)(*(long *)&pGVar77->field_0x58 +
                               pGVar77[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar9);
      p_Var11 = pGVar77[1].intersectionFilterN;
      lVar29 = *(long *)&pGVar77[1].time_range.upper;
      auVar82 = *(undefined1 (*) [16])(lVar29 + (long)p_Var11 * uVar70);
      pauVar3 = (undefined1 (*) [16])(lVar29 + (uVar70 + 1) * (long)p_Var11);
      uVar25 = *(undefined8 *)*pauVar3;
      uVar62 = *(undefined8 *)(*pauVar3 + 8);
      auVar24 = *pauVar3;
      auVar22 = *pauVar3;
      auVar20 = *pauVar3;
      auVar83 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar29 + (uVar70 + 2) * (long)p_Var11);
      uVar63 = *(undefined8 *)*pauVar4;
      uVar64 = *(undefined8 *)(*pauVar4 + 8);
      auVar23 = *pauVar4;
      auVar21 = *pauVar4;
      auVar19 = *pauVar4;
      auVar90 = *pauVar4;
      uVar78 = uVar78 - 1 & uVar78;
      pauVar5 = (undefined1 (*) [12])(lVar29 + (uVar70 + 3) * (long)p_Var11);
      uVar65 = *(undefined8 *)*pauVar5;
      uVar66 = *(undefined8 *)(*pauVar5 + 8);
      local_6c0 = (float)uVar65;
      fStack_6bc = (float)((ulong)uVar65 >> 0x20);
      fStack_6b8 = (float)uVar66;
      fStack_6b4 = (float)((ulong)uVar66 >> 0x20);
      if (uVar78 != 0) {
        uVar74 = uVar78 - 1 & uVar78;
        for (uVar70 = uVar78; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        }
        if (uVar74 != 0) {
          for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar73 = (int)pGVar77[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar84 = vsubps_avx(auVar82,auVar89);
      uVar144 = auVar84._0_4_;
      auVar167._4_4_ = uVar144;
      auVar167._0_4_ = uVar144;
      auVar167._8_4_ = uVar144;
      auVar167._12_4_ = uVar144;
      auVar85 = vshufps_avx(auVar84,auVar84,0x55);
      auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
      aVar6 = pre->ray_space[k].vx.field_0;
      aVar7 = pre->ray_space[k].vy.field_0;
      fVar165 = pre->ray_space[k].vz.field_0.m128[0];
      fVar159 = pre->ray_space[k].vz.field_0.m128[1];
      fVar160 = pre->ray_space[k].vz.field_0.m128[2];
      fVar161 = pre->ray_space[k].vz.field_0.m128[3];
      auVar210._0_4_ = fVar165 * auVar84._0_4_;
      auVar210._4_4_ = fVar159 * auVar84._4_4_;
      auVar210._8_4_ = fVar160 * auVar84._8_4_;
      auVar210._12_4_ = fVar161 * auVar84._12_4_;
      auVar85 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar7,auVar85);
      auVar145 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar6,auVar167);
      auVar85 = vshufps_avx(auVar82,auVar82,0xff);
      auVar88 = vsubps_avx(auVar83,auVar89);
      uVar144 = auVar88._0_4_;
      auVar177._4_4_ = uVar144;
      auVar177._0_4_ = uVar144;
      auVar177._8_4_ = uVar144;
      auVar177._12_4_ = uVar144;
      auVar84 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar212._0_4_ = fVar165 * auVar88._0_4_;
      auVar212._4_4_ = fVar159 * auVar88._4_4_;
      auVar212._8_4_ = fVar160 * auVar88._8_4_;
      auVar212._12_4_ = fVar161 * auVar88._12_4_;
      auVar84 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar7,auVar84);
      auVar146 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar6,auVar177);
      auVar84 = vshufps_avx(auVar83,auVar83,0xff);
      auVar86 = vsubps_avx512vl(auVar90,auVar89);
      uVar144 = auVar86._0_4_;
      auVar208._4_4_ = uVar144;
      auVar208._0_4_ = uVar144;
      auVar208._8_4_ = uVar144;
      auVar208._12_4_ = uVar144;
      auVar88 = vshufps_avx(auVar86,auVar86,0x55);
      auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
      auVar215._0_4_ = fVar165 * auVar86._0_4_;
      auVar215._4_4_ = fVar159 * auVar86._4_4_;
      auVar215._8_4_ = fVar160 * auVar86._8_4_;
      auVar215._12_4_ = fVar161 * auVar86._12_4_;
      auVar88 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar7,auVar88);
      auVar86 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar6,auVar208);
      auVar87 = vshufps_avx512vl(auVar90,auVar90,0xff);
      auVar67._12_4_ = fStack_6b4;
      auVar67._0_12_ = *pauVar5;
      auVar88 = vsubps_avx512vl(auVar67,auVar89);
      uVar144 = auVar88._0_4_;
      auVar178._4_4_ = uVar144;
      auVar178._0_4_ = uVar144;
      auVar178._8_4_ = uVar144;
      auVar178._12_4_ = uVar144;
      auVar89 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar216._0_4_ = fVar165 * auVar88._0_4_;
      auVar216._4_4_ = fVar159 * auVar88._4_4_;
      auVar216._8_4_ = fVar160 * auVar88._8_4_;
      auVar216._12_4_ = fVar161 * auVar88._12_4_;
      auVar89 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar7,auVar89);
      auVar88 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar6,auVar178);
      lVar29 = (long)iVar73 * 0x44;
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar29);
      auVar89 = vshufps_avx512vl(auVar67,auVar67,0xff);
      uVar144 = auVar145._0_4_;
      local_3c0._4_4_ = uVar144;
      local_3c0._0_4_ = uVar144;
      local_3c0._8_4_ = uVar144;
      local_3c0._12_4_ = uVar144;
      local_3c0._16_4_ = uVar144;
      local_3c0._20_4_ = uVar144;
      local_3c0._24_4_ = uVar144;
      local_3c0._28_4_ = uVar144;
      auVar92._8_4_ = 1;
      auVar92._0_8_ = 0x100000001;
      auVar92._12_4_ = 1;
      auVar92._16_4_ = 1;
      auVar92._20_4_ = 1;
      auVar92._24_4_ = 1;
      auVar92._28_4_ = 1;
      local_3e0 = vpermps_avx2(auVar92,ZEXT1632(auVar145));
      local_80 = vbroadcastsd_avx512vl(auVar85);
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x484);
      uVar144 = auVar146._0_4_;
      auVar163._4_4_ = uVar144;
      auVar163._0_4_ = uVar144;
      auVar163._8_4_ = uVar144;
      auVar163._12_4_ = uVar144;
      local_400._16_4_ = uVar144;
      local_400._0_16_ = auVar163;
      local_400._20_4_ = uVar144;
      local_400._24_4_ = uVar144;
      local_400._28_4_ = uVar144;
      local_420 = vpermps_avx512vl(auVar92,ZEXT1632(auVar146));
      local_a0 = vbroadcastsd_avx512vl(auVar84);
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x908);
      uVar144 = auVar86._0_4_;
      local_440._4_4_ = uVar144;
      local_440._0_4_ = uVar144;
      local_440._8_4_ = uVar144;
      local_440._12_4_ = uVar144;
      local_440._16_4_ = uVar144;
      local_440._20_4_ = uVar144;
      local_440._24_4_ = uVar144;
      local_440._28_4_ = uVar144;
      local_460 = vpermps_avx512vl(auVar92,ZEXT1632(auVar86));
      local_c0 = vbroadcastsd_avx512vl(auVar87);
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0xd8c);
      fVar159 = auVar88._0_4_;
      local_480._4_4_ = fVar159;
      local_480._0_4_ = fVar159;
      fStack_478 = fVar159;
      fStack_474 = fVar159;
      fStack_470 = fVar159;
      fStack_46c = fVar159;
      fStack_468 = fVar159;
      register0x0000139c = fVar159;
      _local_4a0 = vpermps_avx512vl(auVar92,ZEXT1632(auVar88));
      local_e0 = vbroadcastsd_avx512vl(auVar89);
      auVar92 = vmulps_avx512vl(_local_480,auVar105);
      auVar93 = vmulps_avx512vl(_local_4a0,auVar105);
      auVar89 = vfmadd231ps_fma(auVar92,auVar106,local_440);
      auVar92 = vfmadd231ps_avx512vl(auVar93,auVar106,local_460);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar109,local_400);
      auVar94 = vfmadd231ps_avx512vl(auVar92,auVar109,local_420);
      auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar108,local_3c0);
      auVar204 = ZEXT3264(auVar95);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar29);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x484);
      auVar96 = vfmadd231ps_avx512vl(auVar94,auVar108,local_3e0);
      auVar194 = ZEXT3264(auVar96);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x908);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0xd8c);
      auVar97 = vmulps_avx512vl(_local_480,auVar104);
      auVar98 = vmulps_avx512vl(_local_4a0,auVar104);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_440);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_460);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_400);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_420);
      auVar85 = vfmadd231ps_fma(auVar97,auVar92,local_3c0);
      auVar209 = ZEXT1664(auVar85);
      auVar84 = vfmadd231ps_fma(auVar98,auVar92,local_3e0);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar85),auVar95);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar84),auVar96);
      auVar99 = vmulps_avx512vl(auVar96,auVar97);
      auVar100 = vmulps_avx512vl(auVar95,auVar98);
      auVar99 = vsubps_avx512vl(auVar99,auVar100);
      auVar100 = vmulps_avx512vl(local_e0,auVar105);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar109,local_a0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,local_80);
      auVar101 = vmulps_avx512vl(local_e0,auVar104);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar94,local_c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,local_a0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar92,local_80);
      auVar102 = vmulps_avx512vl(auVar98,auVar98);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,auVar97);
      auVar103 = vmaxps_avx512vl(auVar100,auVar101);
      auVar103 = vmulps_avx512vl(auVar103,auVar103);
      auVar102 = vmulps_avx512vl(auVar103,auVar102);
      auVar99 = vmulps_avx512vl(auVar99,auVar99);
      uVar26 = vcmpps_avx512vl(auVar99,auVar102,2);
      auVar89 = vblendps_avx(auVar145,auVar82,8);
      auVar87 = auVar227._0_16_;
      auVar89 = vandps_avx512vl(auVar89,auVar87);
      auVar83 = vblendps_avx(auVar146,auVar83,8);
      auVar83 = vandps_avx512vl(auVar83,auVar87);
      auVar89 = vmaxps_avx(auVar89,auVar83);
      auVar83 = vblendps_avx(auVar86,auVar90,8);
      auVar90 = vandps_avx512vl(auVar83,auVar87);
      auVar83 = vblendps_avx(auVar88,auVar67,8);
      auVar83 = vandps_avx512vl(auVar83,auVar87);
      auVar83 = vmaxps_avx(auVar90,auVar83);
      auVar83 = vmaxps_avx(auVar89,auVar83);
      auVar90 = vmovshdup_avx(auVar83);
      auVar90 = vmaxss_avx(auVar90,auVar83);
      auVar83 = vshufpd_avx(auVar83,auVar83,1);
      auVar83 = vmaxss_avx(auVar83,auVar90);
      auVar90 = vcvtsi2ss_avx512f(auVar87,iVar73);
      local_500._0_16_ = auVar90;
      auVar103._0_4_ = auVar90._0_4_;
      auVar103._4_4_ = auVar103._0_4_;
      auVar103._8_4_ = auVar103._0_4_;
      auVar103._12_4_ = auVar103._0_4_;
      auVar103._16_4_ = auVar103._0_4_;
      auVar103._20_4_ = auVar103._0_4_;
      auVar103._24_4_ = auVar103._0_4_;
      auVar103._28_4_ = auVar103._0_4_;
      uVar27 = vcmpps_avx512vl(auVar103,_DAT_01faff40,0xe);
      bVar79 = (byte)uVar26 & (byte)uVar27;
      fVar165 = auVar83._0_4_ * 4.7683716e-07;
      local_5e0._0_16_ = ZEXT416((uint)fVar165);
      auVar102._8_4_ = 2;
      auVar102._0_8_ = 0x200000002;
      auVar102._12_4_ = 2;
      auVar102._16_4_ = 2;
      auVar102._20_4_ = 2;
      auVar102._24_4_ = 2;
      auVar102._28_4_ = 2;
      local_560 = vpermps_avx512vl(auVar102,ZEXT1632(auVar145));
      auVar228 = ZEXT3264(local_560);
      local_580 = vpermps_avx512vl(auVar102,ZEXT1632(auVar146));
      auVar229 = ZEXT3264(local_580);
      auVar99 = vpermps_avx512vl(auVar102,ZEXT1632(auVar86));
      auVar226 = ZEXT3264(auVar99);
      local_240 = vpermps_avx2(auVar102,ZEXT1632(auVar88));
      local_4e0 = *(undefined4 *)(ray + k * 4 + 0x60);
      uStack_4dc = 0;
      uStack_4d8 = 0;
      uStack_4d4 = 0;
      if (bVar79 != 0) {
        auVar104 = vmulps_avx512vl(local_240,auVar104);
        auVar94 = vfmadd213ps_avx512vl(auVar94,auVar99,auVar104);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_580,auVar94);
        auVar102 = vfmadd213ps_avx512vl(auVar92,local_560,auVar93);
        auVar105 = vmulps_avx512vl(local_240,auVar105);
        auVar106 = vfmadd213ps_avx512vl(auVar106,auVar99,auVar105);
        auVar93 = vfmadd213ps_avx512vl(auVar109,local_580,auVar106);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1210);
        auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1694);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1f9c);
        auVar107 = vfmadd213ps_avx512vl(auVar108,local_560,auVar93);
        auVar213._0_4_ = fVar159 * auVar92._0_4_;
        auVar213._4_4_ = fVar159 * auVar92._4_4_;
        auVar213._8_4_ = fVar159 * auVar92._8_4_;
        auVar213._12_4_ = fVar159 * auVar92._12_4_;
        auVar213._16_4_ = fVar159 * auVar92._16_4_;
        auVar213._20_4_ = fVar159 * auVar92._20_4_;
        auVar213._24_4_ = fVar159 * auVar92._24_4_;
        auVar213._28_4_ = 0;
        auVar108 = vmulps_avx512vl(_local_4a0,auVar92);
        auVar92 = vmulps_avx512vl(local_240,auVar92);
        auVar93 = vfmadd231ps_avx512vl(auVar213,auVar105,local_440);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,local_460);
        auVar105 = vfmadd231ps_avx512vl(auVar92,auVar99,auVar105);
        auVar92 = vfmadd231ps_avx512vl(auVar93,auVar106,local_400);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,local_420);
        auVar93 = vfmadd231ps_avx512vl(auVar105,local_580,auVar106);
        auVar83 = vfmadd231ps_fma(auVar92,auVar109,local_3c0);
        auVar92 = vfmadd231ps_avx512vl(auVar108,auVar109,local_3e0);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1210);
        auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1b18);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1f9c);
        auVar94 = vfmadd231ps_avx512vl(auVar93,local_560,auVar109);
        auVar93._4_4_ = fVar159 * auVar105._4_4_;
        auVar93._0_4_ = fVar159 * auVar105._0_4_;
        auVar93._8_4_ = fVar159 * auVar105._8_4_;
        auVar93._12_4_ = fVar159 * auVar105._12_4_;
        auVar93._16_4_ = fVar159 * auVar105._16_4_;
        auVar93._20_4_ = fVar159 * auVar105._20_4_;
        auVar93._24_4_ = fVar159 * auVar105._24_4_;
        auVar93._28_4_ = auVar109._28_4_;
        auVar109 = vmulps_avx512vl(_local_4a0,auVar105);
        auVar105 = vmulps_avx512vl(local_240,auVar105);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar106,local_440);
        auVar104 = vfmadd231ps_avx512vl(auVar109,auVar106,local_460);
        auVar106 = vfmadd231ps_avx512vl(auVar105,auVar99,auVar106);
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1694);
        auVar105 = vfmadd231ps_avx512vl(auVar93,auVar109,local_400);
        auVar93 = vfmadd231ps_avx512vl(auVar104,auVar109,local_420);
        auVar109 = vfmadd231ps_avx512vl(auVar106,local_580,auVar109);
        auVar90 = vfmadd231ps_fma(auVar105,auVar108,local_3c0);
        auVar106 = vfmadd231ps_avx512vl(auVar93,auVar108,local_3e0);
        auVar105 = vfmadd231ps_avx512vl(auVar109,local_560,auVar108);
        auVar221._8_4_ = 0x7fffffff;
        auVar221._0_8_ = 0x7fffffff7fffffff;
        auVar221._12_4_ = 0x7fffffff;
        auVar221._16_4_ = 0x7fffffff;
        auVar221._20_4_ = 0x7fffffff;
        auVar221._24_4_ = 0x7fffffff;
        auVar221._28_4_ = 0x7fffffff;
        auVar108 = vandps_avx(ZEXT1632(auVar83),auVar221);
        auVar109 = vandps_avx(auVar92,auVar221);
        auVar109 = vmaxps_avx(auVar108,auVar109);
        auVar108 = vandps_avx(auVar94,auVar221);
        auVar108 = vmaxps_avx(auVar109,auVar108);
        auVar217._4_4_ = fVar165;
        auVar217._0_4_ = fVar165;
        auVar217._8_4_ = fVar165;
        auVar217._12_4_ = fVar165;
        auVar217._16_4_ = fVar165;
        auVar217._20_4_ = fVar165;
        auVar217._24_4_ = fVar165;
        auVar217._28_4_ = fVar165;
        uVar70 = vcmpps_avx512vl(auVar108,auVar217,1);
        bVar12 = (bool)((byte)uVar70 & 1);
        auVar110._0_4_ = (float)((uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar83._0_4_);
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar83._4_4_);
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar83._8_4_);
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar83._12_4_);
        fVar160 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar97._16_4_);
        auVar110._16_4_ = fVar160;
        fVar165 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar97._20_4_);
        auVar110._20_4_ = fVar165;
        fVar159 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar97._24_4_);
        auVar110._24_4_ = fVar159;
        uVar71 = (uint)(byte)(uVar70 >> 7) * auVar97._28_4_;
        auVar110._28_4_ = uVar71;
        bVar12 = (bool)((byte)uVar70 & 1);
        auVar111._0_4_ = (float)((uint)bVar12 * auVar98._0_4_ | (uint)!bVar12 * auVar92._0_4_);
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar92._4_4_);
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar92._8_4_);
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar92._12_4_);
        bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * auVar92._16_4_);
        bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * auVar92._20_4_);
        bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * auVar92._24_4_);
        bVar12 = SUB81(uVar70 >> 7,0);
        auVar111._28_4_ = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar92._28_4_;
        auVar108 = vandps_avx(auVar221,ZEXT1632(auVar90));
        auVar109 = vandps_avx(auVar106,auVar221);
        auVar109 = vmaxps_avx(auVar108,auVar109);
        auVar108 = vandps_avx(auVar105,auVar221);
        auVar108 = vmaxps_avx(auVar109,auVar108);
        uVar70 = vcmpps_avx512vl(auVar108,auVar217,1);
        bVar12 = (bool)((byte)uVar70 & 1);
        auVar112._0_4_ = (float)((uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar90._0_4_);
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar90._4_4_);
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar90._8_4_);
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar90._12_4_);
        fVar186 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar97._16_4_);
        auVar112._16_4_ = fVar186;
        fVar174 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar97._20_4_);
        auVar112._20_4_ = fVar174;
        fVar161 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar97._24_4_);
        auVar112._24_4_ = fVar161;
        auVar112._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar97._28_4_;
        bVar12 = (bool)((byte)uVar70 & 1);
        auVar113._0_4_ = (float)((uint)bVar12 * auVar98._0_4_ | (uint)!bVar12 * auVar106._0_4_);
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar106._4_4_);
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar106._8_4_);
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar106._12_4_);
        bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * auVar106._16_4_);
        bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * auVar106._20_4_);
        bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * auVar106._24_4_);
        bVar12 = SUB81(uVar70 >> 7,0);
        auVar113._28_4_ = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar106._28_4_;
        auVar91 = vxorps_avx512vl(auVar163,auVar163);
        auVar108 = vfmadd213ps_avx512vl(auVar110,auVar110,ZEXT1632(auVar91));
        auVar83 = vfmadd231ps_fma(auVar108,auVar111,auVar111);
        auVar106 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        fVar80 = auVar106._0_4_;
        fVar81 = auVar106._4_4_;
        fVar135 = auVar106._8_4_;
        fVar136 = auVar106._12_4_;
        fVar137 = auVar106._16_4_;
        fVar138 = auVar106._20_4_;
        fVar140 = auVar106._24_4_;
        auVar108._4_4_ = fVar81 * fVar81 * fVar81 * auVar83._4_4_ * -0.5;
        auVar108._0_4_ = fVar80 * fVar80 * fVar80 * auVar83._0_4_ * -0.5;
        auVar108._8_4_ = fVar135 * fVar135 * fVar135 * auVar83._8_4_ * -0.5;
        auVar108._12_4_ = fVar136 * fVar136 * fVar136 * auVar83._12_4_ * -0.5;
        auVar108._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar108._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar108._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar108._28_4_ = 0;
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar92,auVar106);
        auVar109._4_4_ = auVar111._4_4_ * auVar108._4_4_;
        auVar109._0_4_ = auVar111._0_4_ * auVar108._0_4_;
        auVar109._8_4_ = auVar111._8_4_ * auVar108._8_4_;
        auVar109._12_4_ = auVar111._12_4_ * auVar108._12_4_;
        auVar109._16_4_ = auVar111._16_4_ * auVar108._16_4_;
        auVar109._20_4_ = auVar111._20_4_ * auVar108._20_4_;
        auVar109._24_4_ = auVar111._24_4_ * auVar108._24_4_;
        auVar109._28_4_ = auVar106._28_4_;
        auVar106._4_4_ = auVar108._4_4_ * -auVar110._4_4_;
        auVar106._0_4_ = auVar108._0_4_ * -auVar110._0_4_;
        auVar106._8_4_ = auVar108._8_4_ * -auVar110._8_4_;
        auVar106._12_4_ = auVar108._12_4_ * -auVar110._12_4_;
        auVar106._16_4_ = auVar108._16_4_ * -fVar160;
        auVar106._20_4_ = auVar108._20_4_ * -fVar165;
        auVar106._24_4_ = auVar108._24_4_ * -fVar159;
        auVar106._28_4_ = uVar71 ^ 0x80000000;
        auVar93 = vmulps_avx512vl(auVar108,ZEXT1632(auVar91));
        auVar97 = ZEXT1632(auVar91);
        auVar105 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar97);
        auVar83 = vfmadd231ps_fma(auVar105,auVar113,auVar113);
        auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        fVar165 = auVar104._0_4_;
        fVar159 = auVar104._4_4_;
        fVar160 = auVar104._8_4_;
        fVar80 = auVar104._12_4_;
        fVar81 = auVar104._16_4_;
        fVar135 = auVar104._20_4_;
        fVar136 = auVar104._24_4_;
        auVar105._4_4_ = fVar159 * fVar159 * fVar159 * auVar83._4_4_ * -0.5;
        auVar105._0_4_ = fVar165 * fVar165 * fVar165 * auVar83._0_4_ * -0.5;
        auVar105._8_4_ = fVar160 * fVar160 * fVar160 * auVar83._8_4_ * -0.5;
        auVar105._12_4_ = fVar80 * fVar80 * fVar80 * auVar83._12_4_ * -0.5;
        auVar105._16_4_ = fVar81 * fVar81 * fVar81 * -0.0;
        auVar105._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar105._24_4_ = fVar136 * fVar136 * fVar136 * -0.0;
        auVar105._28_4_ = 0;
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar92,auVar104);
        auVar94._4_4_ = auVar113._4_4_ * auVar105._4_4_;
        auVar94._0_4_ = auVar113._0_4_ * auVar105._0_4_;
        auVar94._8_4_ = auVar113._8_4_ * auVar105._8_4_;
        auVar94._12_4_ = auVar113._12_4_ * auVar105._12_4_;
        auVar94._16_4_ = auVar113._16_4_ * auVar105._16_4_;
        auVar94._20_4_ = auVar113._20_4_ * auVar105._20_4_;
        auVar94._24_4_ = auVar113._24_4_ * auVar105._24_4_;
        auVar94._28_4_ = auVar104._28_4_;
        auVar104._4_4_ = -auVar112._4_4_ * auVar105._4_4_;
        auVar104._0_4_ = -auVar112._0_4_ * auVar105._0_4_;
        auVar104._8_4_ = -auVar112._8_4_ * auVar105._8_4_;
        auVar104._12_4_ = -auVar112._12_4_ * auVar105._12_4_;
        auVar104._16_4_ = -fVar186 * auVar105._16_4_;
        auVar104._20_4_ = -fVar174 * auVar105._20_4_;
        auVar104._24_4_ = -fVar161 * auVar105._24_4_;
        auVar104._28_4_ = auVar108._28_4_;
        auVar108 = vmulps_avx512vl(auVar105,auVar97);
        auVar83 = vfmadd213ps_fma(auVar109,auVar100,auVar95);
        auVar90 = vfmadd213ps_fma(auVar106,auVar100,auVar96);
        auVar105 = vfmadd213ps_avx512vl(auVar93,auVar100,auVar107);
        auVar92 = vfmadd213ps_avx512vl(auVar94,auVar101,ZEXT1632(auVar85));
        auVar86 = vfnmadd213ps_fma(auVar109,auVar100,auVar95);
        auVar89 = vfmadd213ps_fma(auVar104,auVar101,ZEXT1632(auVar84));
        auVar145 = vfnmadd213ps_fma(auVar106,auVar100,auVar96);
        auVar88 = vfmadd213ps_fma(auVar108,auVar101,auVar102);
        auVar109 = vfnmadd231ps_avx512vl(auVar107,auVar100,auVar93);
        auVar146 = vfnmadd213ps_fma(auVar94,auVar101,ZEXT1632(auVar85));
        auVar87 = vfnmadd213ps_fma(auVar104,auVar101,ZEXT1632(auVar84));
        auVar162 = vfnmadd231ps_fma(auVar102,auVar101,auVar108);
        auVar106 = vsubps_avx512vl(auVar92,ZEXT1632(auVar86));
        auVar108 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar145));
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar88),auVar109);
        auVar94 = vmulps_avx512vl(auVar108,auVar109);
        auVar85 = vfmsub231ps_fma(auVar94,ZEXT1632(auVar145),auVar93);
        auVar95._4_4_ = auVar86._4_4_ * auVar93._4_4_;
        auVar95._0_4_ = auVar86._0_4_ * auVar93._0_4_;
        auVar95._8_4_ = auVar86._8_4_ * auVar93._8_4_;
        auVar95._12_4_ = auVar86._12_4_ * auVar93._12_4_;
        auVar95._16_4_ = auVar93._16_4_ * 0.0;
        auVar95._20_4_ = auVar93._20_4_ * 0.0;
        auVar95._24_4_ = auVar93._24_4_ * 0.0;
        auVar95._28_4_ = auVar93._28_4_;
        auVar93 = vfmsub231ps_avx512vl(auVar95,auVar109,auVar106);
        auVar96._4_4_ = auVar145._4_4_ * auVar106._4_4_;
        auVar96._0_4_ = auVar145._0_4_ * auVar106._0_4_;
        auVar96._8_4_ = auVar145._8_4_ * auVar106._8_4_;
        auVar96._12_4_ = auVar145._12_4_ * auVar106._12_4_;
        auVar96._16_4_ = auVar106._16_4_ * 0.0;
        auVar96._20_4_ = auVar106._20_4_ * 0.0;
        auVar96._24_4_ = auVar106._24_4_ * 0.0;
        auVar96._28_4_ = auVar106._28_4_;
        auVar84 = vfmsub231ps_fma(auVar96,ZEXT1632(auVar86),auVar108);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar97,auVar93);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,ZEXT1632(auVar85));
        auVar102 = ZEXT1632(auVar91);
        uVar70 = vcmpps_avx512vl(auVar108,auVar102,2);
        bVar69 = (byte)uVar70;
        fVar80 = (float)((uint)(bVar69 & 1) * auVar83._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar146._0_4_);
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar135 = (float)((uint)bVar12 * auVar83._4_4_ | (uint)!bVar12 * auVar146._4_4_);
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar137 = (float)((uint)bVar12 * auVar83._8_4_ | (uint)!bVar12 * auVar146._8_4_);
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar140 = (float)((uint)bVar12 * auVar83._12_4_ | (uint)!bVar12 * auVar146._12_4_);
        auVar94 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar137,CONCAT44(fVar135,fVar80))));
        fVar81 = (float)((uint)(bVar69 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar87._0_4_);
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar136 = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar87._4_4_);
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar138 = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar87._8_4_);
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar141 = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar87._12_4_);
        auVar104 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar138,CONCAT44(fVar136,fVar81))));
        auVar114._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar105._0_4_ |
                    (uint)!(bool)(bVar69 & 1) * auVar162._0_4_);
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar162._4_4_);
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar162._8_4_);
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar162._12_4_);
        fVar160 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar105._16_4_);
        auVar114._16_4_ = fVar160;
        fVar159 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar105._20_4_);
        auVar114._20_4_ = fVar159;
        fVar165 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar105._24_4_);
        auVar114._24_4_ = fVar165;
        iVar1 = (uint)(byte)(uVar70 >> 7) * auVar105._28_4_;
        auVar114._28_4_ = iVar1;
        auVar106 = vblendmps_avx512vl(ZEXT1632(auVar86),auVar92);
        auVar115._0_4_ =
             (uint)(bVar69 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar85._0_4_;
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar85._4_4_;
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar85._8_4_;
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar85._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_;
        auVar115._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
        auVar106 = vblendmps_avx512vl(ZEXT1632(auVar145),ZEXT1632(auVar89));
        auVar116._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar90._0_4_
                    );
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar90._4_4_);
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar90._8_4_);
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar90._12_4_);
        fVar186 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_);
        auVar116._16_4_ = fVar186;
        fVar174 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_);
        auVar116._20_4_ = fVar174;
        fVar161 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_);
        auVar116._24_4_ = fVar161;
        auVar116._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
        auVar106 = vblendmps_avx512vl(auVar109,ZEXT1632(auVar88));
        auVar117._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar106._0_4_ |
                    (uint)!(bool)(bVar69 & 1) * auVar105._0_4_);
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar105._4_4_);
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar105._8_4_);
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar105._12_4_);
        bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * auVar105._16_4_);
        bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * auVar105._20_4_);
        bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * auVar105._24_4_);
        bVar12 = SUB81(uVar70 >> 7,0);
        auVar117._28_4_ = (uint)bVar12 * auVar106._28_4_ | (uint)!bVar12 * auVar105._28_4_;
        auVar118._0_4_ =
             (uint)(bVar69 & 1) * (int)auVar86._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar92._0_4_;
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar12 * (int)auVar86._4_4_ | (uint)!bVar12 * auVar92._4_4_;
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar12 * (int)auVar86._8_4_ | (uint)!bVar12 * auVar92._8_4_;
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar12 * (int)auVar86._12_4_ | (uint)!bVar12 * auVar92._12_4_;
        auVar118._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar92._16_4_;
        auVar118._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar92._20_4_;
        auVar118._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar92._24_4_;
        auVar118._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar92._28_4_;
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar119._0_4_ =
             (uint)(bVar69 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar88._0_4_;
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar88._4_4_;
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar88._8_4_;
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar88._12_4_;
        auVar119._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar109._16_4_;
        auVar119._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar109._20_4_;
        auVar119._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar109._24_4_;
        iVar2 = (uint)(byte)(uVar70 >> 7) * auVar109._28_4_;
        auVar119._28_4_ = iVar2;
        auVar95 = vsubps_avx512vl(auVar118,auVar94);
        auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar145._12_4_ |
                                                 (uint)!bVar15 * auVar89._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar145._8_4_ |
                                                          (uint)!bVar14 * auVar89._8_4_,
                                                          CONCAT44((uint)bVar12 *
                                                                   (int)auVar145._4_4_ |
                                                                   (uint)!bVar12 * auVar89._4_4_,
                                                                   (uint)(bVar69 & 1) *
                                                                   (int)auVar145._0_4_ |
                                                                   (uint)!(bool)(bVar69 & 1) *
                                                                   auVar89._0_4_)))),auVar104);
        auVar204 = ZEXT3264(auVar109);
        auVar106 = vsubps_avx(auVar119,auVar114);
        auVar105 = vsubps_avx(auVar94,auVar115);
        auVar209 = ZEXT3264(auVar105);
        auVar92 = vsubps_avx(auVar104,auVar116);
        auVar93 = vsubps_avx(auVar114,auVar117);
        auVar97._4_4_ = auVar106._4_4_ * fVar135;
        auVar97._0_4_ = auVar106._0_4_ * fVar80;
        auVar97._8_4_ = auVar106._8_4_ * fVar137;
        auVar97._12_4_ = auVar106._12_4_ * fVar140;
        auVar97._16_4_ = auVar106._16_4_ * 0.0;
        auVar97._20_4_ = auVar106._20_4_ * 0.0;
        auVar97._24_4_ = auVar106._24_4_ * 0.0;
        auVar97._28_4_ = iVar2;
        auVar83 = vfmsub231ps_fma(auVar97,auVar114,auVar95);
        auVar98._4_4_ = fVar136 * auVar95._4_4_;
        auVar98._0_4_ = fVar81 * auVar95._0_4_;
        auVar98._8_4_ = fVar138 * auVar95._8_4_;
        auVar98._12_4_ = fVar141 * auVar95._12_4_;
        auVar98._16_4_ = auVar95._16_4_ * 0.0;
        auVar98._20_4_ = auVar95._20_4_ * 0.0;
        auVar98._24_4_ = auVar95._24_4_ * 0.0;
        auVar98._28_4_ = auVar108._28_4_;
        auVar90 = vfmsub231ps_fma(auVar98,auVar94,auVar109);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar102,ZEXT1632(auVar83));
        auVar189._0_4_ = auVar109._0_4_ * auVar114._0_4_;
        auVar189._4_4_ = auVar109._4_4_ * auVar114._4_4_;
        auVar189._8_4_ = auVar109._8_4_ * auVar114._8_4_;
        auVar189._12_4_ = auVar109._12_4_ * auVar114._12_4_;
        auVar189._16_4_ = auVar109._16_4_ * fVar160;
        auVar189._20_4_ = auVar109._20_4_ * fVar159;
        auVar189._24_4_ = auVar109._24_4_ * fVar165;
        auVar189._28_4_ = 0;
        auVar83 = vfmsub231ps_fma(auVar189,auVar104,auVar106);
        auVar96 = vfmadd231ps_avx512vl(auVar108,auVar102,ZEXT1632(auVar83));
        auVar108 = vmulps_avx512vl(auVar93,auVar115);
        auVar108 = vfmsub231ps_avx512vl(auVar108,auVar105,auVar117);
        auVar107._4_4_ = auVar92._4_4_ * auVar117._4_4_;
        auVar107._0_4_ = auVar92._0_4_ * auVar117._0_4_;
        auVar107._8_4_ = auVar92._8_4_ * auVar117._8_4_;
        auVar107._12_4_ = auVar92._12_4_ * auVar117._12_4_;
        auVar107._16_4_ = auVar92._16_4_ * auVar117._16_4_;
        auVar107._20_4_ = auVar92._20_4_ * auVar117._20_4_;
        auVar107._24_4_ = auVar92._24_4_ * auVar117._24_4_;
        auVar107._28_4_ = auVar117._28_4_;
        auVar83 = vfmsub231ps_fma(auVar107,auVar116,auVar93);
        auVar190._0_4_ = auVar116._0_4_ * auVar105._0_4_;
        auVar190._4_4_ = auVar116._4_4_ * auVar105._4_4_;
        auVar190._8_4_ = auVar116._8_4_ * auVar105._8_4_;
        auVar190._12_4_ = auVar116._12_4_ * auVar105._12_4_;
        auVar190._16_4_ = fVar186 * auVar105._16_4_;
        auVar190._20_4_ = fVar174 * auVar105._20_4_;
        auVar190._24_4_ = fVar161 * auVar105._24_4_;
        auVar190._28_4_ = 0;
        auVar90 = vfmsub231ps_fma(auVar190,auVar92,auVar115);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar102,auVar108);
        auVar97 = vfmadd231ps_avx512vl(auVar108,auVar102,ZEXT1632(auVar83));
        auVar194 = ZEXT3264(auVar97);
        auVar108 = vmaxps_avx(auVar96,auVar97);
        uVar26 = vcmpps_avx512vl(auVar108,auVar102,2);
        bVar79 = bVar79 & (byte)uVar26;
        if (bVar79 != 0) {
          uVar144 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar222._4_4_ = uVar144;
          auVar222._0_4_ = uVar144;
          auVar222._8_4_ = uVar144;
          auVar222._12_4_ = uVar144;
          auVar222._16_4_ = uVar144;
          auVar222._20_4_ = uVar144;
          auVar222._24_4_ = uVar144;
          auVar222._28_4_ = uVar144;
          auVar225 = ZEXT3264(auVar222);
          auVar35._4_4_ = auVar93._4_4_ * auVar109._4_4_;
          auVar35._0_4_ = auVar93._0_4_ * auVar109._0_4_;
          auVar35._8_4_ = auVar93._8_4_ * auVar109._8_4_;
          auVar35._12_4_ = auVar93._12_4_ * auVar109._12_4_;
          auVar35._16_4_ = auVar93._16_4_ * auVar109._16_4_;
          auVar35._20_4_ = auVar93._20_4_ * auVar109._20_4_;
          auVar35._24_4_ = auVar93._24_4_ * auVar109._24_4_;
          auVar35._28_4_ = auVar108._28_4_;
          auVar85 = vfmsub231ps_fma(auVar35,auVar92,auVar106);
          auVar36._4_4_ = auVar106._4_4_ * auVar105._4_4_;
          auVar36._0_4_ = auVar106._0_4_ * auVar105._0_4_;
          auVar36._8_4_ = auVar106._8_4_ * auVar105._8_4_;
          auVar36._12_4_ = auVar106._12_4_ * auVar105._12_4_;
          auVar36._16_4_ = auVar106._16_4_ * auVar105._16_4_;
          auVar36._20_4_ = auVar106._20_4_ * auVar105._20_4_;
          auVar36._24_4_ = auVar106._24_4_ * auVar105._24_4_;
          auVar36._28_4_ = auVar106._28_4_;
          auVar89 = vfmsub231ps_fma(auVar36,auVar95,auVar93);
          auVar37._4_4_ = auVar92._4_4_ * auVar95._4_4_;
          auVar37._0_4_ = auVar92._0_4_ * auVar95._0_4_;
          auVar37._8_4_ = auVar92._8_4_ * auVar95._8_4_;
          auVar37._12_4_ = auVar92._12_4_ * auVar95._12_4_;
          auVar37._16_4_ = auVar92._16_4_ * auVar95._16_4_;
          auVar37._20_4_ = auVar92._20_4_ * auVar95._20_4_;
          auVar37._24_4_ = auVar92._24_4_ * auVar95._24_4_;
          auVar37._28_4_ = auVar92._28_4_;
          auVar84 = vfmsub231ps_fma(auVar37,auVar105,auVar109);
          auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar84));
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar108 = vrcp14ps_avx512vl(ZEXT1632(auVar90));
          auVar209 = ZEXT3264(auVar108);
          auVar31._8_4_ = 0x3f800000;
          auVar31._0_8_ = 0x3f8000003f800000;
          auVar31._12_4_ = 0x3f800000;
          auVar31._16_4_ = 0x3f800000;
          auVar31._20_4_ = 0x3f800000;
          auVar31._24_4_ = 0x3f800000;
          auVar31._28_4_ = 0x3f800000;
          auVar109 = vfnmadd213ps_avx512vl(auVar108,ZEXT1632(auVar90),auVar31);
          auVar83 = vfmadd132ps_fma(auVar109,auVar108,auVar108);
          auVar204 = ZEXT1664(auVar83);
          auVar38._4_4_ = auVar84._4_4_ * auVar114._4_4_;
          auVar38._0_4_ = auVar84._0_4_ * auVar114._0_4_;
          auVar38._8_4_ = auVar84._8_4_ * auVar114._8_4_;
          auVar38._12_4_ = auVar84._12_4_ * auVar114._12_4_;
          auVar38._16_4_ = fVar160 * 0.0;
          auVar38._20_4_ = fVar159 * 0.0;
          auVar38._24_4_ = fVar165 * 0.0;
          auVar38._28_4_ = iVar1;
          auVar89 = vfmadd231ps_fma(auVar38,auVar104,ZEXT1632(auVar89));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar94,ZEXT1632(auVar85));
          fVar165 = auVar83._0_4_;
          fVar159 = auVar83._4_4_;
          fVar160 = auVar83._8_4_;
          fVar161 = auVar83._12_4_;
          local_360 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar161,
                                         CONCAT48(auVar89._8_4_ * fVar160,
                                                  CONCAT44(auVar89._4_4_ * fVar159,
                                                           auVar89._0_4_ * fVar165))));
          auVar211 = ZEXT3264(local_360);
          auVar151._4_4_ = local_4e0;
          auVar151._0_4_ = local_4e0;
          auVar151._8_4_ = local_4e0;
          auVar151._12_4_ = local_4e0;
          auVar151._16_4_ = local_4e0;
          auVar151._20_4_ = local_4e0;
          auVar151._24_4_ = local_4e0;
          auVar151._28_4_ = local_4e0;
          uVar26 = vcmpps_avx512vl(local_360,auVar222,2);
          uVar27 = vcmpps_avx512vl(auVar151,local_360,2);
          bVar79 = (byte)uVar26 & (byte)uVar27 & bVar79;
          if (bVar79 != 0) {
            uVar74 = vcmpps_avx512vl(ZEXT1632(auVar90),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar74 = bVar79 & uVar74;
            if ((char)uVar74 != '\0') {
              fVar174 = auVar96._0_4_ * fVar165;
              fVar186 = auVar96._4_4_ * fVar159;
              auVar39._4_4_ = fVar186;
              auVar39._0_4_ = fVar174;
              fVar80 = auVar96._8_4_ * fVar160;
              auVar39._8_4_ = fVar80;
              fVar81 = auVar96._12_4_ * fVar161;
              auVar39._12_4_ = fVar81;
              fVar135 = auVar96._16_4_ * 0.0;
              auVar39._16_4_ = fVar135;
              fVar136 = auVar96._20_4_ * 0.0;
              auVar39._20_4_ = fVar136;
              fVar137 = auVar96._24_4_ * 0.0;
              auVar39._24_4_ = fVar137;
              auVar39._28_4_ = auVar96._28_4_;
              auVar152._8_4_ = 0x3f800000;
              auVar152._0_8_ = 0x3f8000003f800000;
              auVar152._12_4_ = 0x3f800000;
              auVar152._16_4_ = 0x3f800000;
              auVar152._20_4_ = 0x3f800000;
              auVar152._24_4_ = 0x3f800000;
              auVar152._28_4_ = 0x3f800000;
              auVar108 = vsubps_avx(auVar152,auVar39);
              local_3a0._0_4_ =
                   (float)((uint)(bVar69 & 1) * (int)fVar174 |
                          (uint)!(bool)(bVar69 & 1) * auVar108._0_4_);
              bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
              local_3a0._4_4_ =
                   (float)((uint)bVar12 * (int)fVar186 | (uint)!bVar12 * auVar108._4_4_);
              bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
              local_3a0._8_4_ = (float)((uint)bVar12 * (int)fVar80 | (uint)!bVar12 * auVar108._8_4_)
              ;
              bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
              local_3a0._12_4_ =
                   (float)((uint)bVar12 * (int)fVar81 | (uint)!bVar12 * auVar108._12_4_);
              bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
              local_3a0._16_4_ =
                   (float)((uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar108._16_4_);
              bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
              local_3a0._20_4_ =
                   (float)((uint)bVar12 * (int)fVar136 | (uint)!bVar12 * auVar108._20_4_);
              bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
              local_3a0._24_4_ =
                   (float)((uint)bVar12 * (int)fVar137 | (uint)!bVar12 * auVar108._24_4_);
              bVar12 = SUB81(uVar70 >> 7,0);
              local_3a0._28_4_ =
                   (float)((uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar108._28_4_);
              auVar108 = vsubps_avx(auVar101,auVar100);
              auVar83 = vfmadd213ps_fma(auVar108,local_3a0,auVar100);
              uVar144 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar100._4_4_ = uVar144;
              auVar100._0_4_ = uVar144;
              auVar100._8_4_ = uVar144;
              auVar100._12_4_ = uVar144;
              auVar100._16_4_ = uVar144;
              auVar100._20_4_ = uVar144;
              auVar100._24_4_ = uVar144;
              auVar100._28_4_ = uVar144;
              auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                            CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                     CONCAT44(auVar83._4_4_ +
                                                                              auVar83._4_4_,
                                                                              auVar83._0_4_ +
                                                                              auVar83._0_4_)))),
                                         auVar100);
              uVar28 = vcmpps_avx512vl(local_360,auVar108,6);
              uVar74 = uVar74 & uVar28;
              bVar79 = (byte)uVar74;
              if (bVar79 != 0) {
                auVar172._0_4_ = auVar97._0_4_ * fVar165;
                auVar172._4_4_ = auVar97._4_4_ * fVar159;
                auVar172._8_4_ = auVar97._8_4_ * fVar160;
                auVar172._12_4_ = auVar97._12_4_ * fVar161;
                auVar172._16_4_ = auVar97._16_4_ * 0.0;
                auVar172._20_4_ = auVar97._20_4_ * 0.0;
                auVar172._24_4_ = auVar97._24_4_ * 0.0;
                auVar172._28_4_ = 0;
                auVar183._8_4_ = 0x3f800000;
                auVar183._0_8_ = 0x3f8000003f800000;
                auVar183._12_4_ = 0x3f800000;
                auVar183._16_4_ = 0x3f800000;
                auVar183._20_4_ = 0x3f800000;
                auVar183._24_4_ = 0x3f800000;
                auVar183._28_4_ = 0x3f800000;
                auVar108 = vsubps_avx(auVar183,auVar172);
                auVar120._0_4_ =
                     (uint)(bVar69 & 1) * (int)auVar172._0_4_ |
                     (uint)!(bool)(bVar69 & 1) * auVar108._0_4_;
                bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                auVar120._4_4_ = (uint)bVar12 * (int)auVar172._4_4_ | (uint)!bVar12 * auVar108._4_4_
                ;
                bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                auVar120._8_4_ = (uint)bVar12 * (int)auVar172._8_4_ | (uint)!bVar12 * auVar108._8_4_
                ;
                bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
                auVar120._12_4_ =
                     (uint)bVar12 * (int)auVar172._12_4_ | (uint)!bVar12 * auVar108._12_4_;
                bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                auVar120._16_4_ =
                     (uint)bVar12 * (int)auVar172._16_4_ | (uint)!bVar12 * auVar108._16_4_;
                bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
                auVar120._20_4_ =
                     (uint)bVar12 * (int)auVar172._20_4_ | (uint)!bVar12 * auVar108._20_4_;
                bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
                auVar120._24_4_ =
                     (uint)bVar12 * (int)auVar172._24_4_ | (uint)!bVar12 * auVar108._24_4_;
                auVar120._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar108._28_4_;
                auVar101._8_4_ = 0x40000000;
                auVar101._0_8_ = 0x4000000040000000;
                auVar101._12_4_ = 0x40000000;
                auVar101._16_4_ = 0x40000000;
                auVar101._20_4_ = 0x40000000;
                auVar101._24_4_ = 0x40000000;
                auVar101._28_4_ = 0x40000000;
                local_380 = vfmsub132ps_avx512vl(auVar120,auVar183,auVar101);
                local_340 = 0;
                auVar209 = ZEXT1664(auVar82);
                if ((pGVar77->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar165 = 1.0 / auVar103._0_4_;
                  local_2e0[0] = fVar165 * (local_3a0._0_4_ + 0.0);
                  local_2e0[1] = fVar165 * (local_3a0._4_4_ + 1.0);
                  local_2e0[2] = fVar165 * (local_3a0._8_4_ + 2.0);
                  local_2e0[3] = fVar165 * (local_3a0._12_4_ + 3.0);
                  fStack_2d0 = fVar165 * (local_3a0._16_4_ + 4.0);
                  fStack_2cc = fVar165 * (local_3a0._20_4_ + 5.0);
                  fStack_2c8 = fVar165 * (local_3a0._24_4_ + 6.0);
                  fStack_2c4 = local_3a0._28_4_ + 7.0;
                  local_2c0 = local_380;
                  local_2a0 = local_360;
                  auVar153._8_4_ = 0x7f800000;
                  auVar153._0_8_ = 0x7f8000007f800000;
                  auVar153._12_4_ = 0x7f800000;
                  auVar153._16_4_ = 0x7f800000;
                  auVar153._20_4_ = 0x7f800000;
                  auVar153._24_4_ = 0x7f800000;
                  auVar153._28_4_ = 0x7f800000;
                  auVar108 = vblendmps_avx512vl(auVar153,local_360);
                  auVar121._0_4_ =
                       (uint)(bVar79 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                  auVar121._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
                  auVar121._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
                  auVar121._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
                  auVar121._16_4_ = (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
                  auVar121._20_4_ = (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
                  auVar121._24_4_ = (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = SUB81(uVar74 >> 7,0);
                  auVar121._28_4_ = (uint)bVar12 * auVar108._28_4_ | (uint)!bVar12 * 0x7f800000;
                  auVar108 = vshufps_avx(auVar121,auVar121,0xb1);
                  auVar108 = vminps_avx(auVar121,auVar108);
                  auVar109 = vshufpd_avx(auVar108,auVar108,5);
                  auVar108 = vminps_avx(auVar108,auVar109);
                  auVar109 = vpermpd_avx2(auVar108,0x4e);
                  auVar108 = vminps_avx(auVar108,auVar109);
                  uVar26 = vcmpps_avx512vl(auVar121,auVar108,0);
                  uVar71 = (uint)uVar74;
                  if (((byte)uVar26 & bVar79) != 0) {
                    uVar71 = (uint)((byte)uVar26 & bVar79);
                  }
                  uVar72 = 0;
                  for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                    uVar72 = uVar72 + 1;
                  }
                  uVar70 = (ulong)uVar72;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_4c0 = vpbroadcastd_avx512vl();
                    local_540 = vpbroadcastd_avx512vl();
                    local_600 = auVar99;
                    local_5c0 = local_360;
                    local_5a0 = pGVar77;
                    local_33c = iVar73;
                    local_330 = auVar82;
                    local_320 = uVar25;
                    uStack_318 = uVar62;
                    local_310 = uVar63;
                    uStack_308 = uVar64;
                    local_300 = uVar65;
                    uStack_2f8 = uVar66;
                    do {
                      local_1c0 = local_2e0[uVar70];
                      local_1a0 = *(undefined4 *)(local_2c0 + uVar70 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar70 * 4)
                      ;
                      local_678.context = context->user;
                      fVar159 = 1.0 - local_1c0;
                      fVar165 = fVar159 * fVar159 * -3.0;
                      auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159)),
                                                ZEXT416((uint)(local_1c0 * fVar159)),
                                                ZEXT416(0xc0000000));
                      auVar90 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar159)),
                                                ZEXT416((uint)(local_1c0 * local_1c0)),
                                                ZEXT416(0x40000000));
                      fVar159 = auVar83._0_4_ * 3.0;
                      fVar160 = auVar90._0_4_ * 3.0;
                      fVar161 = local_1c0 * local_1c0 * 3.0;
                      auVar200._0_4_ = fVar161 * local_6c0;
                      auVar200._4_4_ = fVar161 * fStack_6bc;
                      auVar200._8_4_ = fVar161 * fStack_6b8;
                      auVar200._12_4_ = fVar161 * fStack_6b4;
                      auVar149._4_4_ = fVar160;
                      auVar149._0_4_ = fVar160;
                      auVar149._8_4_ = fVar160;
                      auVar149._12_4_ = fVar160;
                      auVar83 = vfmadd132ps_fma(auVar149,auVar200,auVar19);
                      auVar182._4_4_ = fVar159;
                      auVar182._0_4_ = fVar159;
                      auVar182._8_4_ = fVar159;
                      auVar182._12_4_ = fVar159;
                      auVar83 = vfmadd132ps_fma(auVar182,auVar83,auVar20);
                      auVar150._4_4_ = fVar165;
                      auVar150._0_4_ = fVar165;
                      auVar150._8_4_ = fVar165;
                      auVar150._12_4_ = fVar165;
                      auVar83 = vfmadd213ps_fma(auVar150,auVar82,auVar83);
                      local_220 = auVar83._0_4_;
                      auVar99._8_4_ = 1;
                      auVar99._0_8_ = 0x100000001;
                      auVar99._12_4_ = 1;
                      auVar99._16_4_ = 1;
                      auVar99._20_4_ = 1;
                      auVar99._24_4_ = 1;
                      auVar99._28_4_ = 1;
                      local_200 = vpermps_avx2(auVar99,ZEXT1632(auVar83));
                      auVar194 = ZEXT3264(local_200);
                      auVar201._8_4_ = 2;
                      auVar201._0_8_ = 0x200000002;
                      auVar201._12_4_ = 2;
                      auVar203._16_4_ = 2;
                      auVar203._0_16_ = auVar201;
                      auVar203._20_4_ = 2;
                      auVar203._24_4_ = 2;
                      auVar203._28_4_ = 2;
                      auVar204 = ZEXT3264(auVar203);
                      local_1e0 = vpermps_avx2(auVar203,ZEXT1632(auVar83));
                      iStack_21c = local_220;
                      iStack_218 = local_220;
                      iStack_214 = local_220;
                      iStack_210 = local_220;
                      iStack_20c = local_220;
                      iStack_208 = local_220;
                      iStack_204 = local_220;
                      fStack_1bc = local_1c0;
                      fStack_1b8 = local_1c0;
                      fStack_1b4 = local_1c0;
                      fStack_1b0 = local_1c0;
                      fStack_1ac = local_1c0;
                      fStack_1a8 = local_1c0;
                      fStack_1a4 = local_1c0;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = local_540._0_8_;
                      uStack_178 = local_540._8_8_;
                      uStack_170 = local_540._16_8_;
                      uStack_168 = local_540._24_8_;
                      local_160 = local_4c0;
                      auVar108 = vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_648[1] = auVar108;
                      *local_648 = auVar108;
                      local_140 = (local_678.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_678.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_640 = local_260;
                      local_678.valid = (int *)local_640;
                      local_678.geometryUserPtr = pGVar77->userPtr;
                      local_678.hit = (RTCHitN *)&local_220;
                      local_678.N = 8;
                      local_520 = auVar225._0_32_;
                      local_678.ray = (RTCRayN *)ray;
                      if (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar194 = ZEXT1664(local_200._0_16_);
                        auVar204 = ZEXT1664(auVar201);
                        (*pGVar77->intersectionFilterN)(&local_678);
                        auVar211 = ZEXT3264(local_5c0);
                        auVar225 = ZEXT3264(local_520);
                        auVar226 = ZEXT3264(local_600);
                        auVar229 = ZEXT3264(local_580);
                        auVar228 = ZEXT3264(local_560);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar227 = ZEXT1664(auVar83);
                        pGVar77 = local_5a0;
                      }
                      if (local_640 == (undefined1  [32])0x0) {
LAB_01b0bc36:
                        *(int *)(ray + k * 4 + 0x100) = auVar225._0_4_;
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar77->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar194 = ZEXT1664(auVar194._0_16_);
                          auVar204 = ZEXT1664(auVar204._0_16_);
                          (*p_Var11)(&local_678);
                          auVar211 = ZEXT3264(local_5c0);
                          auVar225 = ZEXT3264(local_520);
                          auVar226 = ZEXT3264(local_600);
                          auVar229 = ZEXT3264(local_580);
                          auVar228 = ZEXT3264(local_560);
                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar227 = ZEXT1664(auVar83);
                          pGVar77 = local_5a0;
                        }
                        if (local_640 == (undefined1  [32])0x0) goto LAB_01b0bc36;
                        uVar28 = vptestmd_avx512vl(local_640,local_640);
                        iVar1 = *(int *)(local_678.hit + 4);
                        iVar2 = *(int *)(local_678.hit + 8);
                        iVar57 = *(int *)(local_678.hit + 0xc);
                        iVar58 = *(int *)(local_678.hit + 0x10);
                        iVar59 = *(int *)(local_678.hit + 0x14);
                        iVar60 = *(int *)(local_678.hit + 0x18);
                        iVar61 = *(int *)(local_678.hit + 0x1c);
                        bVar79 = (byte)uVar28;
                        bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar18 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_678.ray + 0x180) =
                             (uint)(bVar79 & 1) * *(int *)local_678.hit |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_678.ray + 0x180);
                        *(uint *)(local_678.ray + 0x184) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_678.ray + 0x184);
                        *(uint *)(local_678.ray + 0x188) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_678.ray + 0x188);
                        *(uint *)(local_678.ray + 0x18c) =
                             (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_678.ray + 0x18c)
                        ;
                        *(uint *)(local_678.ray + 400) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_678.ray + 400);
                        *(uint *)(local_678.ray + 0x194) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_678.ray + 0x194)
                        ;
                        *(uint *)(local_678.ray + 0x198) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_678.ray + 0x198)
                        ;
                        *(uint *)(local_678.ray + 0x19c) =
                             (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_678.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x24);
                        iVar2 = *(int *)(local_678.hit + 0x28);
                        iVar57 = *(int *)(local_678.hit + 0x2c);
                        iVar58 = *(int *)(local_678.hit + 0x30);
                        iVar59 = *(int *)(local_678.hit + 0x34);
                        iVar60 = *(int *)(local_678.hit + 0x38);
                        iVar61 = *(int *)(local_678.hit + 0x3c);
                        bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar18 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_678.ray + 0x1a0) =
                             (uint)(bVar79 & 1) * *(int *)(local_678.hit + 0x20) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_678.ray + 0x1a0);
                        *(uint *)(local_678.ray + 0x1a4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_678.ray + 0x1a4);
                        *(uint *)(local_678.ray + 0x1a8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_678.ray + 0x1a8);
                        *(uint *)(local_678.ray + 0x1ac) =
                             (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_678.ray + 0x1ac)
                        ;
                        *(uint *)(local_678.ray + 0x1b0) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_678.ray + 0x1b0)
                        ;
                        *(uint *)(local_678.ray + 0x1b4) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_678.ray + 0x1b4)
                        ;
                        *(uint *)(local_678.ray + 0x1b8) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_678.ray + 0x1b8)
                        ;
                        *(uint *)(local_678.ray + 0x1bc) =
                             (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_678.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x44);
                        iVar2 = *(int *)(local_678.hit + 0x48);
                        iVar57 = *(int *)(local_678.hit + 0x4c);
                        iVar58 = *(int *)(local_678.hit + 0x50);
                        iVar59 = *(int *)(local_678.hit + 0x54);
                        iVar60 = *(int *)(local_678.hit + 0x58);
                        iVar61 = *(int *)(local_678.hit + 0x5c);
                        bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar18 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_678.ray + 0x1c0) =
                             (uint)(bVar79 & 1) * *(int *)(local_678.hit + 0x40) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_678.ray + 0x1c0);
                        *(uint *)(local_678.ray + 0x1c4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_678.ray + 0x1c4);
                        *(uint *)(local_678.ray + 0x1c8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_678.ray + 0x1c8);
                        *(uint *)(local_678.ray + 0x1cc) =
                             (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_678.ray + 0x1cc)
                        ;
                        *(uint *)(local_678.ray + 0x1d0) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_678.ray + 0x1d0)
                        ;
                        *(uint *)(local_678.ray + 0x1d4) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_678.ray + 0x1d4)
                        ;
                        *(uint *)(local_678.ray + 0x1d8) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_678.ray + 0x1d8)
                        ;
                        *(uint *)(local_678.ray + 0x1dc) =
                             (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_678.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 100);
                        iVar2 = *(int *)(local_678.hit + 0x68);
                        iVar57 = *(int *)(local_678.hit + 0x6c);
                        iVar58 = *(int *)(local_678.hit + 0x70);
                        iVar59 = *(int *)(local_678.hit + 0x74);
                        iVar60 = *(int *)(local_678.hit + 0x78);
                        iVar61 = *(int *)(local_678.hit + 0x7c);
                        bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar18 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_678.ray + 0x1e0) =
                             (uint)(bVar79 & 1) * *(int *)(local_678.hit + 0x60) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_678.ray + 0x1e0);
                        *(uint *)(local_678.ray + 0x1e4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_678.ray + 0x1e4);
                        *(uint *)(local_678.ray + 0x1e8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_678.ray + 0x1e8);
                        *(uint *)(local_678.ray + 0x1ec) =
                             (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_678.ray + 0x1ec)
                        ;
                        *(uint *)(local_678.ray + 0x1f0) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_678.ray + 0x1f0)
                        ;
                        *(uint *)(local_678.ray + 500) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_678.ray + 500);
                        *(uint *)(local_678.ray + 0x1f8) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_678.ray + 0x1f8)
                        ;
                        *(uint *)(local_678.ray + 0x1fc) =
                             (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_678.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x84);
                        iVar2 = *(int *)(local_678.hit + 0x88);
                        iVar57 = *(int *)(local_678.hit + 0x8c);
                        iVar58 = *(int *)(local_678.hit + 0x90);
                        iVar59 = *(int *)(local_678.hit + 0x94);
                        iVar60 = *(int *)(local_678.hit + 0x98);
                        iVar61 = *(int *)(local_678.hit + 0x9c);
                        bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar18 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_678.ray + 0x200) =
                             (uint)(bVar79 & 1) * *(int *)(local_678.hit + 0x80) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_678.ray + 0x200);
                        *(uint *)(local_678.ray + 0x204) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_678.ray + 0x204);
                        *(uint *)(local_678.ray + 0x208) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_678.ray + 0x208);
                        *(uint *)(local_678.ray + 0x20c) =
                             (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_678.ray + 0x20c)
                        ;
                        *(uint *)(local_678.ray + 0x210) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_678.ray + 0x210)
                        ;
                        *(uint *)(local_678.ray + 0x214) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_678.ray + 0x214)
                        ;
                        *(uint *)(local_678.ray + 0x218) =
                             (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_678.ray + 0x218)
                        ;
                        *(uint *)(local_678.ray + 0x21c) =
                             (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_678.ray + 0x21c)
                        ;
                        auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xa0));
                        *(undefined1 (*) [32])(local_678.ray + 0x220) = auVar108;
                        auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xc0));
                        *(undefined1 (*) [32])(local_678.ray + 0x240) = auVar108;
                        auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xe0));
                        *(undefined1 (*) [32])(local_678.ray + 0x260) = auVar108;
                        auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_678.ray + 0x280) = auVar108;
                        auVar225 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      auVar99 = auVar226._0_32_;
                      bVar79 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar74;
                      uVar144 = auVar225._0_4_;
                      auVar157._4_4_ = uVar144;
                      auVar157._0_4_ = uVar144;
                      auVar157._8_4_ = uVar144;
                      auVar157._12_4_ = uVar144;
                      auVar157._16_4_ = uVar144;
                      auVar157._20_4_ = uVar144;
                      auVar157._24_4_ = uVar144;
                      auVar157._28_4_ = uVar144;
                      uVar26 = vcmpps_avx512vl(auVar211._0_32_,auVar157,2);
                      if ((bVar79 & (byte)uVar26) == 0) goto LAB_01b0ab11;
                      bVar79 = bVar79 & (byte)uVar26;
                      uVar74 = (ulong)bVar79;
                      auVar158._8_4_ = 0x7f800000;
                      auVar158._0_8_ = 0x7f8000007f800000;
                      auVar158._12_4_ = 0x7f800000;
                      auVar158._16_4_ = 0x7f800000;
                      auVar158._20_4_ = 0x7f800000;
                      auVar158._24_4_ = 0x7f800000;
                      auVar158._28_4_ = 0x7f800000;
                      auVar108 = vblendmps_avx512vl(auVar158,auVar211._0_32_);
                      auVar134._0_4_ =
                           (uint)(bVar79 & 1) * auVar108._0_4_ |
                           (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                      bVar12 = (bool)(bVar79 >> 1 & 1);
                      auVar134._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar79 >> 2 & 1);
                      auVar134._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar79 >> 3 & 1);
                      auVar134._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar79 >> 4 & 1);
                      auVar134._16_4_ = (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar79 >> 5 & 1);
                      auVar134._20_4_ = (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar79 >> 6 & 1);
                      auVar134._24_4_ = (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                      auVar134._28_4_ =
                           (uint)(bVar79 >> 7) * auVar108._28_4_ |
                           (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
                      auVar108 = vshufps_avx(auVar134,auVar134,0xb1);
                      auVar108 = vminps_avx(auVar134,auVar108);
                      auVar109 = vshufpd_avx(auVar108,auVar108,5);
                      auVar108 = vminps_avx(auVar108,auVar109);
                      auVar109 = vpermpd_avx2(auVar108,0x4e);
                      auVar108 = vminps_avx(auVar108,auVar109);
                      uVar26 = vcmpps_avx512vl(auVar134,auVar108,0);
                      bVar69 = (byte)uVar26 & bVar79;
                      if (bVar69 != 0) {
                        bVar79 = bVar69;
                      }
                      uVar71 = 0;
                      for (uVar72 = (uint)bVar79; (uVar72 & 1) == 0;
                          uVar72 = uVar72 >> 1 | 0x80000000) {
                        uVar71 = uVar71 + 1;
                      }
                      uVar70 = (ulong)uVar71;
                    } while( true );
                  }
                  fVar165 = local_2e0[uVar70];
                  uVar144 = *(undefined4 *)(local_2c0 + uVar70 * 4);
                  fVar160 = 1.0 - fVar165;
                  fVar159 = fVar160 * fVar160 * -3.0;
                  auVar194 = ZEXT464((uint)fVar159);
                  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),
                                            ZEXT416((uint)(fVar165 * fVar160)),ZEXT416(0xc0000000));
                  auVar90 = vfmsub132ss_fma(ZEXT416((uint)(fVar165 * fVar160)),
                                            ZEXT416((uint)(fVar165 * fVar165)),ZEXT416(0x40000000));
                  fVar160 = auVar83._0_4_ * 3.0;
                  fVar161 = auVar90._0_4_ * 3.0;
                  fVar174 = fVar165 * fVar165 * 3.0;
                  auVar196._0_4_ = fVar174 * local_6c0;
                  auVar196._4_4_ = fVar174 * fStack_6bc;
                  auVar196._8_4_ = fVar174 * fStack_6b8;
                  auVar196._12_4_ = fVar174 * fStack_6b4;
                  auVar204 = ZEXT1664(auVar196);
                  auVar168._4_4_ = fVar161;
                  auVar168._0_4_ = fVar161;
                  auVar168._8_4_ = fVar161;
                  auVar168._12_4_ = fVar161;
                  auVar83 = vfmadd132ps_fma(auVar168,auVar196,*pauVar4);
                  auVar179._4_4_ = fVar160;
                  auVar179._0_4_ = fVar160;
                  auVar179._8_4_ = fVar160;
                  auVar179._12_4_ = fVar160;
                  auVar83 = vfmadd132ps_fma(auVar179,auVar83,*pauVar3);
                  auVar169._4_4_ = fVar159;
                  auVar169._0_4_ = fVar159;
                  auVar169._8_4_ = fVar159;
                  auVar169._12_4_ = fVar159;
                  auVar83 = vfmadd213ps_fma(auVar169,auVar82,auVar83);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar70 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar83._0_4_;
                  uVar10 = vextractps_avx(auVar83,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                  uVar10 = vextractps_avx(auVar83,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar165;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar144;
                  *(uint *)(ray + k * 4 + 0x220) = uVar9;
                  *(uint *)(ray + k * 4 + 0x240) = uVar75;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_01b0ab11:
                  auVar209 = ZEXT1664(auVar82);
                }
              }
            }
          }
        }
      }
      if (8 < iVar73) {
        auVar108 = vpbroadcastd_avx512vl();
        auVar226 = ZEXT3264(auVar108);
        local_520._4_4_ = local_5e0._0_4_;
        local_520._0_4_ = local_5e0._0_4_;
        local_520._8_4_ = local_5e0._0_4_;
        local_520._12_4_ = local_5e0._0_4_;
        local_520._16_4_ = local_5e0._0_4_;
        local_520._20_4_ = local_5e0._0_4_;
        local_520._24_4_ = local_5e0._0_4_;
        local_520._28_4_ = local_5e0._0_4_;
        uStack_4dc = local_4e0;
        uStack_4d8 = local_4e0;
        uStack_4d4 = local_4e0;
        uStack_4d0 = local_4e0;
        uStack_4cc = local_4e0;
        uStack_4c8 = local_4e0;
        uStack_4c4 = local_4e0;
        fStack_598 = 1.0 / (float)local_500._0_4_;
        local_500 = vpbroadcastd_avx512vl();
        local_4c0 = vpbroadcastd_avx512vl();
        lVar76 = 8;
        local_600 = auVar99;
        fStack_594 = fStack_598;
        fStack_590 = fStack_598;
        fStack_58c = fStack_598;
        fStack_588 = fStack_598;
        fStack_584 = fStack_598;
        local_5a0._0_4_ = fStack_598;
        local_5a0._4_4_ = fStack_598;
LAB_01b0abc5:
        auVar108 = vpbroadcastd_avx512vl();
        auVar108 = vpor_avx2(auVar108,_DAT_01fe9900);
        uVar27 = vpcmpgtd_avx512vl(auVar226._0_32_,auVar108);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar76 * 4 + lVar29);
        auVar109 = *(undefined1 (*) [32])(lVar29 + 0x21aa768 + lVar76 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar29 + 0x21aabec + lVar76 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar29 + 0x21ab070 + lVar76 * 4);
        auVar211._0_4_ = auVar105._0_4_ * (float)local_480._0_4_;
        auVar211._4_4_ = auVar105._4_4_ * (float)local_480._4_4_;
        auVar211._8_4_ = auVar105._8_4_ * fStack_478;
        auVar211._12_4_ = auVar105._12_4_ * fStack_474;
        auVar211._16_4_ = auVar105._16_4_ * fStack_470;
        auVar211._20_4_ = auVar105._20_4_ * fStack_46c;
        auVar211._28_36_ = auVar204._28_36_;
        auVar211._24_4_ = auVar105._24_4_ * fStack_468;
        auVar204._0_4_ = auVar105._0_4_ * (float)local_4a0._0_4_;
        auVar204._4_4_ = auVar105._4_4_ * (float)local_4a0._4_4_;
        auVar204._8_4_ = auVar105._8_4_ * fStack_498;
        auVar204._12_4_ = auVar105._12_4_ * fStack_494;
        auVar204._16_4_ = auVar105._16_4_ * fStack_490;
        auVar204._20_4_ = auVar105._20_4_ * fStack_48c;
        auVar204._28_36_ = auVar194._28_36_;
        auVar204._24_4_ = auVar105._24_4_ * fStack_488;
        auVar92 = vmulps_avx512vl(local_e0,auVar105);
        auVar93 = vfmadd231ps_avx512vl(auVar211._0_32_,auVar106,local_440);
        auVar94 = vfmadd231ps_avx512vl(auVar204._0_32_,auVar106,local_460);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar106,local_c0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar109,local_400);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar109,local_420);
        auVar104 = vfmadd231ps_avx512vl(auVar92,auVar109,local_a0);
        auVar83 = vfmadd231ps_fma(auVar93,auVar108,local_3c0);
        auVar204 = ZEXT1664(auVar83);
        auVar90 = vfmadd231ps_fma(auVar94,auVar108,local_3e0);
        auVar194 = ZEXT1664(auVar90);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar76 * 4 + lVar29);
        auVar93 = *(undefined1 (*) [32])(lVar29 + 0x21acb88 + lVar76 * 4);
        auVar97 = vfmadd231ps_avx512vl(auVar104,auVar108,local_80);
        auVar94 = *(undefined1 (*) [32])(lVar29 + 0x21ad00c + lVar76 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar29 + 0x21ad490 + lVar76 * 4);
        auVar225._0_4_ = auVar104._0_4_ * (float)local_480._0_4_;
        auVar225._4_4_ = auVar104._4_4_ * (float)local_480._4_4_;
        auVar225._8_4_ = auVar104._8_4_ * fStack_478;
        auVar225._12_4_ = auVar104._12_4_ * fStack_474;
        auVar225._16_4_ = auVar104._16_4_ * fStack_470;
        auVar225._20_4_ = auVar104._20_4_ * fStack_46c;
        auVar225._28_36_ = auVar209._28_36_;
        auVar225._24_4_ = auVar104._24_4_ * fStack_468;
        auVar40._4_4_ = auVar104._4_4_ * (float)local_4a0._4_4_;
        auVar40._0_4_ = auVar104._0_4_ * (float)local_4a0._0_4_;
        auVar40._8_4_ = auVar104._8_4_ * fStack_498;
        auVar40._12_4_ = auVar104._12_4_ * fStack_494;
        auVar40._16_4_ = auVar104._16_4_ * fStack_490;
        auVar40._20_4_ = auVar104._20_4_ * fStack_48c;
        auVar40._24_4_ = auVar104._24_4_ * fStack_488;
        auVar40._28_4_ = uStack_484;
        auVar95 = vmulps_avx512vl(local_e0,auVar104);
        auVar96 = vfmadd231ps_avx512vl(auVar225._0_32_,auVar94,local_440);
        auVar98 = vfmadd231ps_avx512vl(auVar40,auVar94,local_460);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,local_c0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_400);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_420);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_a0);
        auVar19 = vfmadd231ps_fma(auVar96,auVar92,local_3c0);
        auVar209 = ZEXT1664(auVar19);
        auVar20 = vfmadd231ps_fma(auVar98,auVar92,local_3e0);
        auVar98 = vfmadd231ps_avx512vl(auVar95,auVar92,local_80);
        auVar99 = vmaxps_avx512vl(auVar97,auVar98);
        auVar95 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar83));
        auVar96 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar90));
        auVar100 = vmulps_avx512vl(ZEXT1632(auVar90),auVar95);
        auVar101 = vmulps_avx512vl(ZEXT1632(auVar83),auVar96);
        auVar100 = vsubps_avx512vl(auVar100,auVar101);
        auVar101 = vmulps_avx512vl(auVar96,auVar96);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,auVar95);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        auVar99 = vmulps_avx512vl(auVar99,auVar101);
        auVar100 = vmulps_avx512vl(auVar100,auVar100);
        uVar26 = vcmpps_avx512vl(auVar100,auVar99,2);
        bVar79 = (byte)uVar27 & (byte)uVar26;
        if (bVar79 != 0) {
          auVar104 = vmulps_avx512vl(local_240,auVar104);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_600,auVar104);
          local_580 = auVar229._0_32_;
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_580,auVar94);
          local_560 = auVar228._0_32_;
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_560,auVar93);
          auVar105 = vmulps_avx512vl(local_240,auVar105);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_600,auVar105);
          auVar109 = vfmadd213ps_avx512vl(auVar109,local_580,auVar106);
          auVar93 = vfmadd213ps_avx512vl(auVar108,local_560,auVar109);
          auVar108 = *(undefined1 (*) [32])(lVar29 + 0x21ab4f4 + lVar76 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar29 + 0x21ab978 + lVar76 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar29 + 0x21abdfc + lVar76 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar29 + 0x21ac280 + lVar76 * 4);
          auVar94 = vmulps_avx512vl(_local_480,auVar105);
          auVar104 = vmulps_avx512vl(_local_4a0,auVar105);
          auVar105 = vmulps_avx512vl(local_240,auVar105);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar106,local_440);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar106,local_460);
          auVar89 = vfmadd231ps_fma(auVar105,auVar106,local_600);
          auVar106 = vfmadd231ps_avx512vl(auVar94,auVar109,local_400);
          auVar105 = vfmadd231ps_avx512vl(auVar104,auVar109,local_420);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),local_580,auVar109);
          auVar94 = vfmadd231ps_avx512vl(auVar106,auVar108,local_3c0);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,local_3e0);
          auVar104 = vfmadd231ps_avx512vl(auVar109,local_560,auVar108);
          auVar108 = *(undefined1 (*) [32])(lVar29 + 0x21ad914 + lVar76 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar29 + 0x21ae21c + lVar76 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar29 + 0x21ae6a0 + lVar76 * 4);
          auVar99 = vmulps_avx512vl(_local_480,auVar106);
          auVar100 = vmulps_avx512vl(_local_4a0,auVar106);
          auVar106 = vmulps_avx512vl(local_240,auVar106);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar109,local_440);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar109,local_460);
          auVar106 = vfmadd231ps_avx512vl(auVar106,local_600,auVar109);
          auVar109 = *(undefined1 (*) [32])(lVar29 + 0x21add98 + lVar76 * 4);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar109,local_400);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar109,local_420);
          auVar109 = vfmadd231ps_avx512vl(auVar106,local_580,auVar109);
          auVar106 = vfmadd231ps_avx512vl(auVar99,auVar108,local_3c0);
          auVar99 = vfmadd231ps_avx512vl(auVar100,auVar108,local_3e0);
          auVar109 = vfmadd231ps_avx512vl(auVar109,local_560,auVar108);
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar94,auVar100);
          vandps_avx512vl(auVar105,auVar100);
          auVar108 = vmaxps_avx(auVar100,auVar100);
          vandps_avx512vl(auVar104,auVar100);
          auVar108 = vmaxps_avx(auVar108,auVar100);
          uVar70 = vcmpps_avx512vl(auVar108,local_520,1);
          bVar12 = (bool)((byte)uVar70 & 1);
          auVar122._0_4_ = (float)((uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar94._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar94._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar94._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar94._12_4_);
          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar94._16_4_);
          bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar94._20_4_);
          bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar94._24_4_);
          bVar12 = SUB81(uVar70 >> 7,0);
          auVar122._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar94._28_4_;
          bVar12 = (bool)((byte)uVar70 & 1);
          auVar123._0_4_ = (float)((uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar105._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar105._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar105._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar105._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar123._16_4_ = (float)((uint)bVar12 * auVar96._16_4_ | (uint)!bVar12 * auVar105._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar123._20_4_ = (float)((uint)bVar12 * auVar96._20_4_ | (uint)!bVar12 * auVar105._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar123._24_4_ = (float)((uint)bVar12 * auVar96._24_4_ | (uint)!bVar12 * auVar105._24_4_)
          ;
          bVar12 = SUB81(uVar70 >> 7,0);
          auVar123._28_4_ = (uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar105._28_4_;
          vandps_avx512vl(auVar106,auVar100);
          vandps_avx512vl(auVar99,auVar100);
          auVar108 = vmaxps_avx(auVar123,auVar123);
          vandps_avx512vl(auVar109,auVar100);
          auVar108 = vmaxps_avx(auVar108,auVar123);
          uVar70 = vcmpps_avx512vl(auVar108,local_520,1);
          bVar12 = (bool)((byte)uVar70 & 1);
          auVar124._0_4_ = (uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar106._0_4_;
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar106._4_4_;
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar106._8_4_;
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar106._12_4_;
          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar106._16_4_;
          bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar106._20_4_;
          bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar106._24_4_;
          bVar12 = SUB81(uVar70 >> 7,0);
          auVar124._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar106._28_4_;
          bVar12 = (bool)((byte)uVar70 & 1);
          auVar125._0_4_ = (float)((uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar99._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar99._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar99._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar99._12_4_);
          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar125._16_4_ = (float)((uint)bVar12 * auVar96._16_4_ | (uint)!bVar12 * auVar99._16_4_);
          bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar125._20_4_ = (float)((uint)bVar12 * auVar96._20_4_ | (uint)!bVar12 * auVar99._20_4_);
          bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar125._24_4_ = (float)((uint)bVar12 * auVar96._24_4_ | (uint)!bVar12 * auVar99._24_4_);
          bVar12 = SUB81(uVar70 >> 7,0);
          auVar125._28_4_ = (uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar99._28_4_;
          auVar214._8_4_ = 0x80000000;
          auVar214._0_8_ = 0x8000000080000000;
          auVar214._12_4_ = 0x80000000;
          auVar214._16_4_ = 0x80000000;
          auVar214._20_4_ = 0x80000000;
          auVar214._24_4_ = 0x80000000;
          auVar214._28_4_ = 0x80000000;
          auVar108 = vxorps_avx512vl(auVar124,auVar214);
          auVar91 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
          auVar109 = vfmadd213ps_avx512vl(auVar122,auVar122,ZEXT1632(auVar91));
          auVar89 = vfmadd231ps_fma(auVar109,auVar123,auVar123);
          auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
          auVar223._8_4_ = 0xbf000000;
          auVar223._0_8_ = 0xbf000000bf000000;
          auVar223._12_4_ = 0xbf000000;
          auVar223._16_4_ = 0xbf000000;
          auVar223._20_4_ = 0xbf000000;
          auVar223._24_4_ = 0xbf000000;
          auVar223._28_4_ = 0xbf000000;
          fVar165 = auVar109._0_4_;
          fVar159 = auVar109._4_4_;
          fVar160 = auVar109._8_4_;
          fVar161 = auVar109._12_4_;
          fVar174 = auVar109._16_4_;
          fVar186 = auVar109._20_4_;
          fVar80 = auVar109._24_4_;
          auVar41._4_4_ = fVar159 * fVar159 * fVar159 * auVar89._4_4_ * -0.5;
          auVar41._0_4_ = fVar165 * fVar165 * fVar165 * auVar89._0_4_ * -0.5;
          auVar41._8_4_ = fVar160 * fVar160 * fVar160 * auVar89._8_4_ * -0.5;
          auVar41._12_4_ = fVar161 * fVar161 * fVar161 * auVar89._12_4_ * -0.5;
          auVar41._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
          auVar41._20_4_ = fVar186 * fVar186 * fVar186 * -0.0;
          auVar41._24_4_ = fVar80 * fVar80 * fVar80 * -0.0;
          auVar41._28_4_ = auVar123._28_4_;
          auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar109 = vfmadd231ps_avx512vl(auVar41,auVar106,auVar109);
          auVar42._4_4_ = auVar123._4_4_ * auVar109._4_4_;
          auVar42._0_4_ = auVar123._0_4_ * auVar109._0_4_;
          auVar42._8_4_ = auVar123._8_4_ * auVar109._8_4_;
          auVar42._12_4_ = auVar123._12_4_ * auVar109._12_4_;
          auVar42._16_4_ = auVar123._16_4_ * auVar109._16_4_;
          auVar42._20_4_ = auVar123._20_4_ * auVar109._20_4_;
          auVar42._24_4_ = auVar123._24_4_ * auVar109._24_4_;
          auVar42._28_4_ = 0;
          auVar43._4_4_ = auVar109._4_4_ * -auVar122._4_4_;
          auVar43._0_4_ = auVar109._0_4_ * -auVar122._0_4_;
          auVar43._8_4_ = auVar109._8_4_ * -auVar122._8_4_;
          auVar43._12_4_ = auVar109._12_4_ * -auVar122._12_4_;
          auVar43._16_4_ = auVar109._16_4_ * -auVar122._16_4_;
          auVar43._20_4_ = auVar109._20_4_ * -auVar122._20_4_;
          auVar43._24_4_ = auVar109._24_4_ * -auVar122._24_4_;
          auVar43._28_4_ = auVar123._28_4_;
          auVar105 = vmulps_avx512vl(auVar109,ZEXT1632(auVar91));
          auVar104 = ZEXT1632(auVar91);
          auVar109 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar104);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar125,auVar125);
          auVar94 = vrsqrt14ps_avx512vl(auVar109);
          auVar109 = vmulps_avx512vl(auVar109,auVar223);
          fVar165 = auVar94._0_4_;
          fVar159 = auVar94._4_4_;
          fVar160 = auVar94._8_4_;
          fVar161 = auVar94._12_4_;
          fVar174 = auVar94._16_4_;
          fVar186 = auVar94._20_4_;
          fVar80 = auVar94._24_4_;
          auVar44._4_4_ = fVar159 * fVar159 * fVar159 * auVar109._4_4_;
          auVar44._0_4_ = fVar165 * fVar165 * fVar165 * auVar109._0_4_;
          auVar44._8_4_ = fVar160 * fVar160 * fVar160 * auVar109._8_4_;
          auVar44._12_4_ = fVar161 * fVar161 * fVar161 * auVar109._12_4_;
          auVar44._16_4_ = fVar174 * fVar174 * fVar174 * auVar109._16_4_;
          auVar44._20_4_ = fVar186 * fVar186 * fVar186 * auVar109._20_4_;
          auVar44._24_4_ = fVar80 * fVar80 * fVar80 * auVar109._24_4_;
          auVar44._28_4_ = auVar109._28_4_;
          auVar109 = vfmadd231ps_avx512vl(auVar44,auVar106,auVar94);
          auVar45._4_4_ = auVar125._4_4_ * auVar109._4_4_;
          auVar45._0_4_ = auVar125._0_4_ * auVar109._0_4_;
          auVar45._8_4_ = auVar125._8_4_ * auVar109._8_4_;
          auVar45._12_4_ = auVar125._12_4_ * auVar109._12_4_;
          auVar45._16_4_ = auVar125._16_4_ * auVar109._16_4_;
          auVar45._20_4_ = auVar125._20_4_ * auVar109._20_4_;
          auVar45._24_4_ = auVar125._24_4_ * auVar109._24_4_;
          auVar45._28_4_ = auVar94._28_4_;
          auVar46._4_4_ = auVar109._4_4_ * auVar108._4_4_;
          auVar46._0_4_ = auVar109._0_4_ * auVar108._0_4_;
          auVar46._8_4_ = auVar109._8_4_ * auVar108._8_4_;
          auVar46._12_4_ = auVar109._12_4_ * auVar108._12_4_;
          auVar46._16_4_ = auVar109._16_4_ * auVar108._16_4_;
          auVar46._20_4_ = auVar109._20_4_ * auVar108._20_4_;
          auVar46._24_4_ = auVar109._24_4_ * auVar108._24_4_;
          auVar46._28_4_ = auVar108._28_4_;
          auVar108 = vmulps_avx512vl(auVar109,auVar104);
          auVar89 = vfmadd213ps_fma(auVar42,auVar97,ZEXT1632(auVar83));
          auVar85 = vfmadd213ps_fma(auVar43,auVar97,ZEXT1632(auVar90));
          auVar106 = vfmadd213ps_avx512vl(auVar105,auVar97,auVar93);
          auVar94 = vfmadd213ps_avx512vl(auVar45,auVar98,ZEXT1632(auVar19));
          auVar88 = vfnmadd213ps_fma(auVar42,auVar97,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar46,auVar98,ZEXT1632(auVar20));
          auVar86 = vfnmadd213ps_fma(auVar43,auVar97,ZEXT1632(auVar90));
          auVar90 = vfmadd213ps_fma(auVar108,auVar98,auVar92);
          auVar87 = vfnmadd231ps_fma(auVar93,auVar97,auVar105);
          auVar145 = vfnmadd213ps_fma(auVar45,auVar98,ZEXT1632(auVar19));
          auVar146 = vfnmadd213ps_fma(auVar46,auVar98,ZEXT1632(auVar20));
          auVar162 = vfnmadd231ps_fma(auVar92,auVar98,auVar108);
          auVar92 = vsubps_avx512vl(auVar94,ZEXT1632(auVar88));
          auVar108 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar86));
          auVar109 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar87));
          auVar47._4_4_ = auVar108._4_4_ * auVar87._4_4_;
          auVar47._0_4_ = auVar108._0_4_ * auVar87._0_4_;
          auVar47._8_4_ = auVar108._8_4_ * auVar87._8_4_;
          auVar47._12_4_ = auVar108._12_4_ * auVar87._12_4_;
          auVar47._16_4_ = auVar108._16_4_ * 0.0;
          auVar47._20_4_ = auVar108._20_4_ * 0.0;
          auVar47._24_4_ = auVar108._24_4_ * 0.0;
          auVar47._28_4_ = auVar105._28_4_;
          auVar19 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar86),auVar109);
          auVar48._4_4_ = auVar109._4_4_ * auVar88._4_4_;
          auVar48._0_4_ = auVar109._0_4_ * auVar88._0_4_;
          auVar48._8_4_ = auVar109._8_4_ * auVar88._8_4_;
          auVar48._12_4_ = auVar109._12_4_ * auVar88._12_4_;
          auVar48._16_4_ = auVar109._16_4_ * 0.0;
          auVar48._20_4_ = auVar109._20_4_ * 0.0;
          auVar48._24_4_ = auVar109._24_4_ * 0.0;
          auVar48._28_4_ = auVar109._28_4_;
          auVar20 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar87),auVar92);
          auVar49._4_4_ = auVar86._4_4_ * auVar92._4_4_;
          auVar49._0_4_ = auVar86._0_4_ * auVar92._0_4_;
          auVar49._8_4_ = auVar86._8_4_ * auVar92._8_4_;
          auVar49._12_4_ = auVar86._12_4_ * auVar92._12_4_;
          auVar49._16_4_ = auVar92._16_4_ * 0.0;
          auVar49._20_4_ = auVar92._20_4_ * 0.0;
          auVar49._24_4_ = auVar92._24_4_ * 0.0;
          auVar49._28_4_ = auVar92._28_4_;
          auVar84 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar88),auVar108);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar104,ZEXT1632(auVar20));
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,ZEXT1632(auVar19));
          auVar100 = ZEXT1632(auVar91);
          uVar70 = vcmpps_avx512vl(auVar108,auVar100,2);
          bVar69 = (byte)uVar70;
          fVar136 = (float)((uint)(bVar69 & 1) * auVar89._0_4_ |
                           (uint)!(bool)(bVar69 & 1) * auVar145._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar138 = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar145._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar141 = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar145._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar142 = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar145._12_4_);
          auVar104 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar141,CONCAT44(fVar138,fVar136))));
          fVar137 = (float)((uint)(bVar69 & 1) * auVar85._0_4_ |
                           (uint)!(bool)(bVar69 & 1) * auVar146._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar140 = (float)((uint)bVar12 * auVar85._4_4_ | (uint)!bVar12 * auVar146._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar139 = (float)((uint)bVar12 * auVar85._8_4_ | (uint)!bVar12 * auVar146._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar143 = (float)((uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * auVar146._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar139,CONCAT44(fVar140,fVar137))));
          auVar126._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar106._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar162._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar162._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar162._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar126._12_4_ =
               (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar162._12_4_);
          fVar165 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_);
          auVar126._16_4_ = fVar165;
          fVar159 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_);
          auVar126._20_4_ = fVar159;
          fVar160 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_);
          auVar126._24_4_ = fVar160;
          iVar1 = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
          auVar126._28_4_ = iVar1;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar88),auVar94);
          auVar127._0_4_ =
               (uint)(bVar69 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar19._0_4_;
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar19._4_4_;
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar19._8_4_;
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar19._12_4_;
          auVar127._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar108._16_4_;
          auVar127._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar108._20_4_;
          auVar127._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar108._24_4_;
          auVar127._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar83));
          auVar128._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar89._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar89._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar89._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar89._12_4_)
          ;
          fVar186 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar108._16_4_);
          auVar128._16_4_ = fVar186;
          fVar161 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar108._20_4_);
          auVar128._20_4_ = fVar161;
          fVar174 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar108._24_4_);
          auVar128._24_4_ = fVar174;
          auVar128._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar90));
          auVar129._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar85._0_4_);
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar85._4_4_);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar85._8_4_);
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar85._12_4_)
          ;
          fVar135 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar108._16_4_);
          auVar129._16_4_ = fVar135;
          fVar80 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar108._20_4_);
          auVar129._20_4_ = fVar80;
          fVar81 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar108._24_4_);
          auVar129._24_4_ = fVar81;
          iVar2 = (uint)(byte)(uVar70 >> 7) * auVar108._28_4_;
          auVar129._28_4_ = iVar2;
          auVar130._0_4_ =
               (uint)(bVar69 & 1) * (int)auVar88._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar94._0_4_;
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar12 * (int)auVar88._4_4_ | (uint)!bVar12 * auVar94._4_4_;
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar12 * (int)auVar88._8_4_ | (uint)!bVar12 * auVar94._8_4_;
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar12 * (int)auVar88._12_4_ | (uint)!bVar12 * auVar94._12_4_;
          auVar130._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar94._16_4_;
          auVar130._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar94._20_4_;
          auVar130._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar94._24_4_;
          auVar130._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar94._28_4_;
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar94 = vsubps_avx512vl(auVar130,auVar104);
          auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar86._12_4_ |
                                                   (uint)!bVar16 * auVar83._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar86._8_4_ |
                                                            (uint)!bVar14 * auVar83._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar86._4_4_ |
                                                                     (uint)!bVar12 * auVar83._4_4_,
                                                                     (uint)(bVar69 & 1) *
                                                                     (int)auVar86._0_4_ |
                                                                     (uint)!(bool)(bVar69 & 1) *
                                                                     auVar83._0_4_)))),auVar95);
          auVar204 = ZEXT3264(auVar109);
          auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar87._12_4_ |
                                                   (uint)!bVar17 * auVar90._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar87._8_4_ |
                                                            (uint)!bVar15 * auVar90._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar87._4_4_ |
                                                                     (uint)!bVar13 * auVar90._4_4_,
                                                                     (uint)(bVar69 & 1) *
                                                                     (int)auVar87._0_4_ |
                                                                     (uint)!(bool)(bVar69 & 1) *
                                                                     auVar90._0_4_)))),auVar126);
          auVar105 = vsubps_avx(auVar104,auVar127);
          auVar209 = ZEXT3264(auVar105);
          auVar92 = vsubps_avx(auVar95,auVar128);
          auVar93 = vsubps_avx(auVar126,auVar129);
          auVar50._4_4_ = auVar106._4_4_ * fVar138;
          auVar50._0_4_ = auVar106._0_4_ * fVar136;
          auVar50._8_4_ = auVar106._8_4_ * fVar141;
          auVar50._12_4_ = auVar106._12_4_ * fVar142;
          auVar50._16_4_ = auVar106._16_4_ * 0.0;
          auVar50._20_4_ = auVar106._20_4_ * 0.0;
          auVar50._24_4_ = auVar106._24_4_ * 0.0;
          auVar50._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar50,auVar126,auVar94);
          auVar184._0_4_ = fVar137 * auVar94._0_4_;
          auVar184._4_4_ = fVar140 * auVar94._4_4_;
          auVar184._8_4_ = fVar139 * auVar94._8_4_;
          auVar184._12_4_ = fVar143 * auVar94._12_4_;
          auVar184._16_4_ = auVar94._16_4_ * 0.0;
          auVar184._20_4_ = auVar94._20_4_ * 0.0;
          auVar184._24_4_ = auVar94._24_4_ * 0.0;
          auVar184._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar184,auVar104,auVar109);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar100,ZEXT1632(auVar83));
          auVar191._0_4_ = auVar109._0_4_ * auVar126._0_4_;
          auVar191._4_4_ = auVar109._4_4_ * auVar126._4_4_;
          auVar191._8_4_ = auVar109._8_4_ * auVar126._8_4_;
          auVar191._12_4_ = auVar109._12_4_ * auVar126._12_4_;
          auVar191._16_4_ = auVar109._16_4_ * fVar165;
          auVar191._20_4_ = auVar109._20_4_ * fVar159;
          auVar191._24_4_ = auVar109._24_4_ * fVar160;
          auVar191._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar191,auVar95,auVar106);
          auVar96 = vfmadd231ps_avx512vl(auVar108,auVar100,ZEXT1632(auVar83));
          auVar108 = vmulps_avx512vl(auVar93,auVar127);
          auVar108 = vfmsub231ps_avx512vl(auVar108,auVar105,auVar129);
          auVar51._4_4_ = auVar92._4_4_ * auVar129._4_4_;
          auVar51._0_4_ = auVar92._0_4_ * auVar129._0_4_;
          auVar51._8_4_ = auVar92._8_4_ * auVar129._8_4_;
          auVar51._12_4_ = auVar92._12_4_ * auVar129._12_4_;
          auVar51._16_4_ = auVar92._16_4_ * fVar135;
          auVar51._20_4_ = auVar92._20_4_ * fVar80;
          auVar51._24_4_ = auVar92._24_4_ * fVar81;
          auVar51._28_4_ = iVar2;
          auVar83 = vfmsub231ps_fma(auVar51,auVar128,auVar93);
          auVar192._0_4_ = auVar128._0_4_ * auVar105._0_4_;
          auVar192._4_4_ = auVar128._4_4_ * auVar105._4_4_;
          auVar192._8_4_ = auVar128._8_4_ * auVar105._8_4_;
          auVar192._12_4_ = auVar128._12_4_ * auVar105._12_4_;
          auVar192._16_4_ = fVar186 * auVar105._16_4_;
          auVar192._20_4_ = fVar161 * auVar105._20_4_;
          auVar192._24_4_ = fVar174 * auVar105._24_4_;
          auVar192._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar192,auVar92,auVar127);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar100,auVar108);
          auVar99 = vfmadd231ps_avx512vl(auVar108,auVar100,ZEXT1632(auVar83));
          auVar194 = ZEXT3264(auVar99);
          auVar108 = vmaxps_avx(auVar96,auVar99);
          uVar26 = vcmpps_avx512vl(auVar108,auVar100,2);
          bVar79 = bVar79 & (byte)uVar26;
          if (bVar79 != 0) {
            uVar144 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar224._4_4_ = uVar144;
            auVar224._0_4_ = uVar144;
            auVar224._8_4_ = uVar144;
            auVar224._12_4_ = uVar144;
            auVar224._16_4_ = uVar144;
            auVar224._20_4_ = uVar144;
            auVar224._24_4_ = uVar144;
            auVar224._28_4_ = uVar144;
            auVar225 = ZEXT3264(auVar224);
            auVar52._4_4_ = auVar93._4_4_ * auVar109._4_4_;
            auVar52._0_4_ = auVar93._0_4_ * auVar109._0_4_;
            auVar52._8_4_ = auVar93._8_4_ * auVar109._8_4_;
            auVar52._12_4_ = auVar93._12_4_ * auVar109._12_4_;
            auVar52._16_4_ = auVar93._16_4_ * auVar109._16_4_;
            auVar52._20_4_ = auVar93._20_4_ * auVar109._20_4_;
            auVar52._24_4_ = auVar93._24_4_ * auVar109._24_4_;
            auVar52._28_4_ = auVar108._28_4_;
            auVar20 = vfmsub231ps_fma(auVar52,auVar92,auVar106);
            auVar53._4_4_ = auVar106._4_4_ * auVar105._4_4_;
            auVar53._0_4_ = auVar106._0_4_ * auVar105._0_4_;
            auVar53._8_4_ = auVar106._8_4_ * auVar105._8_4_;
            auVar53._12_4_ = auVar106._12_4_ * auVar105._12_4_;
            auVar53._16_4_ = auVar106._16_4_ * auVar105._16_4_;
            auVar53._20_4_ = auVar106._20_4_ * auVar105._20_4_;
            auVar53._24_4_ = auVar106._24_4_ * auVar105._24_4_;
            auVar53._28_4_ = auVar106._28_4_;
            auVar19 = vfmsub231ps_fma(auVar53,auVar94,auVar93);
            auVar54._4_4_ = auVar92._4_4_ * auVar94._4_4_;
            auVar54._0_4_ = auVar92._0_4_ * auVar94._0_4_;
            auVar54._8_4_ = auVar92._8_4_ * auVar94._8_4_;
            auVar54._12_4_ = auVar92._12_4_ * auVar94._12_4_;
            auVar54._16_4_ = auVar92._16_4_ * auVar94._16_4_;
            auVar54._20_4_ = auVar92._20_4_ * auVar94._20_4_;
            auVar54._24_4_ = auVar92._24_4_ * auVar94._24_4_;
            auVar54._28_4_ = auVar92._28_4_;
            auVar89 = vfmsub231ps_fma(auVar54,auVar105,auVar109);
            auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar19),ZEXT1632(auVar89));
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar20),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar108 = vrcp14ps_avx512vl(ZEXT1632(auVar90));
            auVar209 = ZEXT3264(auVar108);
            auVar32._8_4_ = 0x3f800000;
            auVar32._0_8_ = 0x3f8000003f800000;
            auVar32._12_4_ = 0x3f800000;
            auVar32._16_4_ = 0x3f800000;
            auVar32._20_4_ = 0x3f800000;
            auVar32._24_4_ = 0x3f800000;
            auVar32._28_4_ = 0x3f800000;
            auVar109 = vfnmadd213ps_avx512vl(auVar108,ZEXT1632(auVar90),auVar32);
            auVar83 = vfmadd132ps_fma(auVar109,auVar108,auVar108);
            auVar204 = ZEXT1664(auVar83);
            auVar55._4_4_ = auVar89._4_4_ * auVar126._4_4_;
            auVar55._0_4_ = auVar89._0_4_ * auVar126._0_4_;
            auVar55._8_4_ = auVar89._8_4_ * auVar126._8_4_;
            auVar55._12_4_ = auVar89._12_4_ * auVar126._12_4_;
            auVar55._16_4_ = fVar165 * 0.0;
            auVar55._20_4_ = fVar159 * 0.0;
            auVar55._24_4_ = fVar160 * 0.0;
            auVar55._28_4_ = iVar1;
            auVar19 = vfmadd231ps_fma(auVar55,auVar95,ZEXT1632(auVar19));
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar104,ZEXT1632(auVar20));
            fVar165 = auVar83._0_4_;
            fVar159 = auVar83._4_4_;
            fVar160 = auVar83._8_4_;
            fVar161 = auVar83._12_4_;
            local_540 = ZEXT1632(CONCAT412(auVar19._12_4_ * fVar161,
                                           CONCAT48(auVar19._8_4_ * fVar160,
                                                    CONCAT44(auVar19._4_4_ * fVar159,
                                                             auVar19._0_4_ * fVar165))));
            auVar211 = ZEXT3264(local_540);
            uVar26 = vcmpps_avx512vl(local_540,auVar224,2);
            auVar68._4_4_ = uStack_4dc;
            auVar68._0_4_ = local_4e0;
            auVar68._8_4_ = uStack_4d8;
            auVar68._12_4_ = uStack_4d4;
            auVar68._16_4_ = uStack_4d0;
            auVar68._20_4_ = uStack_4cc;
            auVar68._24_4_ = uStack_4c8;
            auVar68._28_4_ = uStack_4c4;
            uVar27 = vcmpps_avx512vl(local_540,auVar68,0xd);
            bVar79 = (byte)uVar26 & (byte)uVar27 & bVar79;
            if (bVar79 != 0) {
              uVar74 = vcmpps_avx512vl(ZEXT1632(auVar90),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar74 = bVar79 & uVar74;
              if ((char)uVar74 != '\0') {
                fVar174 = auVar96._0_4_ * fVar165;
                fVar186 = auVar96._4_4_ * fVar159;
                auVar56._4_4_ = fVar186;
                auVar56._0_4_ = fVar174;
                fVar80 = auVar96._8_4_ * fVar160;
                auVar56._8_4_ = fVar80;
                fVar81 = auVar96._12_4_ * fVar161;
                auVar56._12_4_ = fVar81;
                fVar135 = auVar96._16_4_ * 0.0;
                auVar56._16_4_ = fVar135;
                fVar136 = auVar96._20_4_ * 0.0;
                auVar56._20_4_ = fVar136;
                fVar137 = auVar96._24_4_ * 0.0;
                auVar56._24_4_ = fVar137;
                auVar56._28_4_ = auVar96._28_4_;
                auVar173._8_4_ = 0x3f800000;
                auVar173._0_8_ = 0x3f8000003f800000;
                auVar173._12_4_ = 0x3f800000;
                auVar173._16_4_ = 0x3f800000;
                auVar173._20_4_ = 0x3f800000;
                auVar173._24_4_ = 0x3f800000;
                auVar173._28_4_ = 0x3f800000;
                auVar108 = vsubps_avx(auVar173,auVar56);
                local_3a0._0_4_ =
                     (float)((uint)(bVar69 & 1) * (int)fVar174 |
                            (uint)!(bool)(bVar69 & 1) * auVar108._0_4_);
                bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                local_3a0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar186 | (uint)!bVar12 * auVar108._4_4_);
                bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                local_3a0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar80 | (uint)!bVar12 * auVar108._8_4_);
                bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
                local_3a0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar81 | (uint)!bVar12 * auVar108._12_4_);
                bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                local_3a0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar108._16_4_);
                bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
                local_3a0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar136 | (uint)!bVar12 * auVar108._20_4_);
                bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
                local_3a0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar137 | (uint)!bVar12 * auVar108._24_4_);
                bVar12 = SUB81(uVar70 >> 7,0);
                local_3a0._28_4_ =
                     (float)((uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar108._28_4_);
                auVar108 = vsubps_avx(auVar98,auVar97);
                auVar83 = vfmadd213ps_fma(auVar108,local_3a0,auVar97);
                uVar144 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar33._4_4_ = uVar144;
                auVar33._0_4_ = uVar144;
                auVar33._8_4_ = uVar144;
                auVar33._12_4_ = uVar144;
                auVar33._16_4_ = uVar144;
                auVar33._20_4_ = uVar144;
                auVar33._24_4_ = uVar144;
                auVar33._28_4_ = uVar144;
                auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                              CONCAT48(auVar83._8_4_ + auVar83._8_4_
                                                                       ,CONCAT44(auVar83._4_4_ +
                                                                                 auVar83._4_4_,
                                                                                 auVar83._0_4_ +
                                                                                 auVar83._0_4_)))),
                                           auVar33);
                uVar28 = vcmpps_avx512vl(local_540,auVar108,6);
                uVar74 = uVar74 & uVar28;
                bVar79 = (byte)uVar74;
                if (bVar79 != 0) {
                  auVar164._0_4_ = auVar99._0_4_ * fVar165;
                  auVar164._4_4_ = auVar99._4_4_ * fVar159;
                  auVar164._8_4_ = auVar99._8_4_ * fVar160;
                  auVar164._12_4_ = auVar99._12_4_ * fVar161;
                  auVar164._16_4_ = auVar99._16_4_ * 0.0;
                  auVar164._20_4_ = auVar99._20_4_ * 0.0;
                  auVar164._24_4_ = auVar99._24_4_ * 0.0;
                  auVar164._28_4_ = 0;
                  auVar185._8_4_ = 0x3f800000;
                  auVar185._0_8_ = 0x3f8000003f800000;
                  auVar185._12_4_ = 0x3f800000;
                  auVar185._16_4_ = 0x3f800000;
                  auVar185._20_4_ = 0x3f800000;
                  auVar185._24_4_ = 0x3f800000;
                  auVar185._28_4_ = 0x3f800000;
                  auVar108 = vsubps_avx(auVar185,auVar164);
                  auVar131._0_4_ =
                       (uint)(bVar69 & 1) * (int)auVar164._0_4_ |
                       (uint)!(bool)(bVar69 & 1) * auVar108._0_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar131._4_4_ =
                       (uint)bVar12 * (int)auVar164._4_4_ | (uint)!bVar12 * auVar108._4_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar131._8_4_ =
                       (uint)bVar12 * (int)auVar164._8_4_ | (uint)!bVar12 * auVar108._8_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar131._12_4_ =
                       (uint)bVar12 * (int)auVar164._12_4_ | (uint)!bVar12 * auVar108._12_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                  auVar131._16_4_ =
                       (uint)bVar12 * (int)auVar164._16_4_ | (uint)!bVar12 * auVar108._16_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
                  auVar131._20_4_ =
                       (uint)bVar12 * (int)auVar164._20_4_ | (uint)!bVar12 * auVar108._20_4_;
                  bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
                  auVar131._24_4_ =
                       (uint)bVar12 * (int)auVar164._24_4_ | (uint)!bVar12 * auVar108._24_4_;
                  auVar131._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar108._28_4_;
                  auVar34._8_4_ = 0x40000000;
                  auVar34._0_8_ = 0x4000000040000000;
                  auVar34._12_4_ = 0x40000000;
                  auVar34._16_4_ = 0x40000000;
                  auVar34._20_4_ = 0x40000000;
                  auVar34._24_4_ = 0x40000000;
                  auVar34._28_4_ = 0x40000000;
                  local_380 = vfmsub132ps_avx512vl(auVar131,auVar185,auVar34);
                  local_340 = (undefined4)lVar76;
                  auVar209 = ZEXT1664(auVar82);
                  pGVar77 = (context->scene->geometries).items[uVar75].ptr;
                  if ((pGVar77->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar83 = vcvtsi2ss_avx512f(auVar91,local_340);
                    fVar165 = auVar83._0_4_;
                    local_2e0[0] = (fVar165 + local_3a0._0_4_ + 0.0) * (float)local_5a0;
                    local_2e0[1] = (fVar165 + local_3a0._4_4_ + 1.0) * local_5a0._4_4_;
                    local_2e0[2] = (fVar165 + local_3a0._8_4_ + 2.0) * fStack_598;
                    local_2e0[3] = (fVar165 + local_3a0._12_4_ + 3.0) * fStack_594;
                    fStack_2d0 = (fVar165 + local_3a0._16_4_ + 4.0) * fStack_590;
                    fStack_2cc = (fVar165 + local_3a0._20_4_ + 5.0) * fStack_58c;
                    fStack_2c8 = (fVar165 + local_3a0._24_4_ + 6.0) * fStack_588;
                    fStack_2c4 = fVar165 + local_3a0._28_4_ + 7.0;
                    local_2c0 = local_380;
                    local_2a0 = local_540;
                    auVar154._8_4_ = 0x7f800000;
                    auVar154._0_8_ = 0x7f8000007f800000;
                    auVar154._12_4_ = 0x7f800000;
                    auVar154._16_4_ = 0x7f800000;
                    auVar154._20_4_ = 0x7f800000;
                    auVar154._24_4_ = 0x7f800000;
                    auVar154._28_4_ = 0x7f800000;
                    auVar108 = vblendmps_avx512vl(auVar154,local_540);
                    auVar132._0_4_ =
                         (uint)(bVar79 & 1) * auVar108._0_4_ |
                         (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                    auVar132._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
                    auVar132._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
                    auVar132._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
                    auVar132._16_4_ = (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
                    auVar132._20_4_ = (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
                    auVar132._24_4_ = (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar74 >> 7,0);
                    auVar132._28_4_ = (uint)bVar12 * auVar108._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar108 = vshufps_avx(auVar132,auVar132,0xb1);
                    auVar108 = vminps_avx(auVar132,auVar108);
                    auVar109 = vshufpd_avx(auVar108,auVar108,5);
                    auVar108 = vminps_avx(auVar108,auVar109);
                    auVar109 = vpermpd_avx2(auVar108,0x4e);
                    auVar108 = vminps_avx(auVar108,auVar109);
                    uVar26 = vcmpps_avx512vl(auVar132,auVar108,0);
                    uVar71 = (uint)uVar74;
                    if (((byte)uVar26 & bVar79) != 0) {
                      uVar71 = (uint)((byte)uVar26 & bVar79);
                    }
                    uVar72 = 0;
                    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                      uVar72 = uVar72 + 1;
                    }
                    uVar70 = (ulong)uVar72;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_100 = vmovdqa64_avx512vl(auVar226._0_32_);
                      local_5c0._0_4_ = iVar73;
                      local_608 = uVar78;
                      local_360 = local_540;
                      local_33c = iVar73;
                      local_330 = auVar82;
                      local_320 = uVar25;
                      uStack_318 = uVar62;
                      local_310 = uVar63;
                      uStack_308 = uVar64;
                      local_300 = uVar65;
                      uStack_2f8 = uVar66;
                      do {
                        local_1c0 = local_2e0[uVar70];
                        local_1a0 = *(undefined4 *)(local_2c0 + uVar70 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2a0 + uVar70 * 4);
                        local_678.context = context->user;
                        fVar159 = 1.0 - local_1c0;
                        fVar165 = fVar159 * fVar159 * -3.0;
                        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159)),
                                                  ZEXT416((uint)(local_1c0 * fVar159)),
                                                  ZEXT416(0xc0000000));
                        auVar90 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar159)),
                                                  ZEXT416((uint)(local_1c0 * local_1c0)),
                                                  ZEXT416(0x40000000));
                        fVar159 = auVar83._0_4_ * 3.0;
                        fVar160 = auVar90._0_4_ * 3.0;
                        fVar161 = local_1c0 * local_1c0 * 3.0;
                        auVar198._0_4_ = fVar161 * local_6c0;
                        auVar198._4_4_ = fVar161 * fStack_6bc;
                        auVar198._8_4_ = fVar161 * fStack_6b8;
                        auVar198._12_4_ = fVar161 * fStack_6b4;
                        auVar147._4_4_ = fVar160;
                        auVar147._0_4_ = fVar160;
                        auVar147._8_4_ = fVar160;
                        auVar147._12_4_ = fVar160;
                        auVar83 = vfmadd132ps_fma(auVar147,auVar198,auVar23);
                        auVar181._4_4_ = fVar159;
                        auVar181._0_4_ = fVar159;
                        auVar181._8_4_ = fVar159;
                        auVar181._12_4_ = fVar159;
                        auVar83 = vfmadd132ps_fma(auVar181,auVar83,auVar24);
                        auVar148._4_4_ = fVar165;
                        auVar148._0_4_ = fVar165;
                        auVar148._8_4_ = fVar165;
                        auVar148._12_4_ = fVar165;
                        auVar83 = vfmadd213ps_fma(auVar148,auVar82,auVar83);
                        local_220 = auVar83._0_4_;
                        auVar193._8_4_ = 1;
                        auVar193._0_8_ = 0x100000001;
                        auVar193._12_4_ = 1;
                        auVar193._16_4_ = 1;
                        auVar193._20_4_ = 1;
                        auVar193._24_4_ = 1;
                        auVar193._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar193,ZEXT1632(auVar83));
                        auVar194 = ZEXT3264(local_200);
                        auVar199._8_4_ = 2;
                        auVar199._0_8_ = 0x200000002;
                        auVar199._12_4_ = 2;
                        auVar202._16_4_ = 2;
                        auVar202._0_16_ = auVar199;
                        auVar202._20_4_ = 2;
                        auVar202._24_4_ = 2;
                        auVar202._28_4_ = 2;
                        auVar204 = ZEXT3264(auVar202);
                        local_1e0 = vpermps_avx2(auVar202,ZEXT1632(auVar83));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        fStack_1bc = local_1c0;
                        fStack_1b8 = local_1c0;
                        fStack_1b4 = local_1c0;
                        fStack_1b0 = local_1c0;
                        fStack_1ac = local_1c0;
                        fStack_1a8 = local_1c0;
                        fStack_1a4 = local_1c0;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_4c0._0_8_;
                        uStack_178 = local_4c0._8_8_;
                        uStack_170 = local_4c0._16_8_;
                        uStack_168 = local_4c0._24_8_;
                        local_160 = local_500;
                        auVar108 = vpcmpeqd_avx2(local_500,local_500);
                        local_648[1] = auVar108;
                        *local_648 = auVar108;
                        local_140 = (local_678.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_678.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_640 = local_260;
                        local_678.valid = (int *)local_640;
                        local_678.geometryUserPtr = pGVar77->userPtr;
                        local_678.hit = (RTCHitN *)&local_220;
                        local_678.N = 8;
                        local_5e0 = auVar225._0_32_;
                        local_678.ray = (RTCRayN *)ray;
                        if (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar194 = ZEXT1664(local_200._0_16_);
                          auVar204 = ZEXT1664(auVar199);
                          (*pGVar77->intersectionFilterN)(&local_678);
                          auVar211 = ZEXT3264(local_540);
                          auVar225 = ZEXT3264(local_5e0);
                        }
                        if (local_640 == (undefined1  [32])0x0) {
LAB_01b0b7ae:
                          *(int *)(ray + k * 4 + 0x100) = auVar225._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar77->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar194 = ZEXT1664(auVar194._0_16_);
                            auVar204 = ZEXT1664(auVar204._0_16_);
                            (*p_Var11)(&local_678);
                            auVar211 = ZEXT3264(local_540);
                            auVar225 = ZEXT3264(local_5e0);
                          }
                          if (local_640 == (undefined1  [32])0x0) goto LAB_01b0b7ae;
                          uVar78 = vptestmd_avx512vl(local_640,local_640);
                          iVar73 = *(int *)(local_678.hit + 4);
                          iVar1 = *(int *)(local_678.hit + 8);
                          iVar2 = *(int *)(local_678.hit + 0xc);
                          iVar57 = *(int *)(local_678.hit + 0x10);
                          iVar58 = *(int *)(local_678.hit + 0x14);
                          iVar59 = *(int *)(local_678.hit + 0x18);
                          iVar60 = *(int *)(local_678.hit + 0x1c);
                          bVar79 = (byte)uVar78;
                          bVar12 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar18 = SUB81(uVar78 >> 7,0);
                          *(uint *)(local_678.ray + 0x180) =
                               (uint)(bVar79 & 1) * *(int *)local_678.hit |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_678.ray + 0x180);
                          *(uint *)(local_678.ray + 0x184) =
                               (uint)bVar12 * iVar73 |
                               (uint)!bVar12 * *(int *)(local_678.ray + 0x184);
                          *(uint *)(local_678.ray + 0x188) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_678.ray + 0x188);
                          *(uint *)(local_678.ray + 0x18c) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_678.ray + 0x18c);
                          *(uint *)(local_678.ray + 400) =
                               (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_678.ray + 400)
                          ;
                          *(uint *)(local_678.ray + 0x194) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_678.ray + 0x194);
                          *(uint *)(local_678.ray + 0x198) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x198);
                          *(uint *)(local_678.ray + 0x19c) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x19c);
                          iVar73 = *(int *)(local_678.hit + 0x24);
                          iVar1 = *(int *)(local_678.hit + 0x28);
                          iVar2 = *(int *)(local_678.hit + 0x2c);
                          iVar57 = *(int *)(local_678.hit + 0x30);
                          iVar58 = *(int *)(local_678.hit + 0x34);
                          iVar59 = *(int *)(local_678.hit + 0x38);
                          iVar60 = *(int *)(local_678.hit + 0x3c);
                          bVar12 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar18 = SUB81(uVar78 >> 7,0);
                          *(uint *)(local_678.ray + 0x1a0) =
                               (uint)(bVar79 & 1) * *(int *)(local_678.hit + 0x20) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_678.ray + 0x1a0);
                          *(uint *)(local_678.ray + 0x1a4) =
                               (uint)bVar12 * iVar73 |
                               (uint)!bVar12 * *(int *)(local_678.ray + 0x1a4);
                          *(uint *)(local_678.ray + 0x1a8) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_678.ray + 0x1a8);
                          *(uint *)(local_678.ray + 0x1ac) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_678.ray + 0x1ac);
                          *(uint *)(local_678.ray + 0x1b0) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_678.ray + 0x1b0);
                          *(uint *)(local_678.ray + 0x1b4) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_678.ray + 0x1b4);
                          *(uint *)(local_678.ray + 0x1b8) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x1b8);
                          *(uint *)(local_678.ray + 0x1bc) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x1bc);
                          iVar73 = *(int *)(local_678.hit + 0x44);
                          iVar1 = *(int *)(local_678.hit + 0x48);
                          iVar2 = *(int *)(local_678.hit + 0x4c);
                          iVar57 = *(int *)(local_678.hit + 0x50);
                          iVar58 = *(int *)(local_678.hit + 0x54);
                          iVar59 = *(int *)(local_678.hit + 0x58);
                          iVar60 = *(int *)(local_678.hit + 0x5c);
                          bVar12 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar18 = SUB81(uVar78 >> 7,0);
                          *(uint *)(local_678.ray + 0x1c0) =
                               (uint)(bVar79 & 1) * *(int *)(local_678.hit + 0x40) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_678.ray + 0x1c0);
                          *(uint *)(local_678.ray + 0x1c4) =
                               (uint)bVar12 * iVar73 |
                               (uint)!bVar12 * *(int *)(local_678.ray + 0x1c4);
                          *(uint *)(local_678.ray + 0x1c8) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_678.ray + 0x1c8);
                          *(uint *)(local_678.ray + 0x1cc) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_678.ray + 0x1cc);
                          *(uint *)(local_678.ray + 0x1d0) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_678.ray + 0x1d0);
                          *(uint *)(local_678.ray + 0x1d4) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_678.ray + 0x1d4);
                          *(uint *)(local_678.ray + 0x1d8) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x1d8);
                          *(uint *)(local_678.ray + 0x1dc) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x1dc);
                          iVar73 = *(int *)(local_678.hit + 100);
                          iVar1 = *(int *)(local_678.hit + 0x68);
                          iVar2 = *(int *)(local_678.hit + 0x6c);
                          iVar57 = *(int *)(local_678.hit + 0x70);
                          iVar58 = *(int *)(local_678.hit + 0x74);
                          iVar59 = *(int *)(local_678.hit + 0x78);
                          iVar60 = *(int *)(local_678.hit + 0x7c);
                          bVar12 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar18 = SUB81(uVar78 >> 7,0);
                          *(uint *)(local_678.ray + 0x1e0) =
                               (uint)(bVar79 & 1) * *(int *)(local_678.hit + 0x60) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_678.ray + 0x1e0);
                          *(uint *)(local_678.ray + 0x1e4) =
                               (uint)bVar12 * iVar73 |
                               (uint)!bVar12 * *(int *)(local_678.ray + 0x1e4);
                          *(uint *)(local_678.ray + 0x1e8) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_678.ray + 0x1e8);
                          *(uint *)(local_678.ray + 0x1ec) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_678.ray + 0x1ec);
                          *(uint *)(local_678.ray + 0x1f0) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_678.ray + 0x1f0);
                          *(uint *)(local_678.ray + 500) =
                               (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_678.ray + 500)
                          ;
                          *(uint *)(local_678.ray + 0x1f8) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x1f8);
                          *(uint *)(local_678.ray + 0x1fc) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x1fc);
                          iVar73 = *(int *)(local_678.hit + 0x84);
                          iVar1 = *(int *)(local_678.hit + 0x88);
                          iVar2 = *(int *)(local_678.hit + 0x8c);
                          iVar57 = *(int *)(local_678.hit + 0x90);
                          iVar58 = *(int *)(local_678.hit + 0x94);
                          iVar59 = *(int *)(local_678.hit + 0x98);
                          iVar60 = *(int *)(local_678.hit + 0x9c);
                          bVar12 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar18 = SUB81(uVar78 >> 7,0);
                          *(uint *)(local_678.ray + 0x200) =
                               (uint)(bVar79 & 1) * *(int *)(local_678.hit + 0x80) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_678.ray + 0x200);
                          *(uint *)(local_678.ray + 0x204) =
                               (uint)bVar12 * iVar73 |
                               (uint)!bVar12 * *(int *)(local_678.ray + 0x204);
                          *(uint *)(local_678.ray + 0x208) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_678.ray + 0x208);
                          *(uint *)(local_678.ray + 0x20c) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_678.ray + 0x20c);
                          *(uint *)(local_678.ray + 0x210) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_678.ray + 0x210);
                          *(uint *)(local_678.ray + 0x214) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_678.ray + 0x214);
                          *(uint *)(local_678.ray + 0x218) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x218);
                          *(uint *)(local_678.ray + 0x21c) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x21c);
                          auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x220) = auVar108;
                          auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x240) = auVar108;
                          auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x260) = auVar108;
                          auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_678.hit + 0x100));
                          *(undefined1 (*) [32])(local_678.ray + 0x280) = auVar108;
                          auVar225 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                        }
                        auVar209 = ZEXT1664(auVar82);
                        bVar79 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar74;
                        uVar144 = auVar225._0_4_;
                        auVar155._4_4_ = uVar144;
                        auVar155._0_4_ = uVar144;
                        auVar155._8_4_ = uVar144;
                        auVar155._12_4_ = uVar144;
                        auVar155._16_4_ = uVar144;
                        auVar155._20_4_ = uVar144;
                        auVar155._24_4_ = uVar144;
                        auVar155._28_4_ = uVar144;
                        uVar26 = vcmpps_avx512vl(auVar211._0_32_,auVar155,2);
                        if ((bVar79 & (byte)uVar26) == 0) goto LAB_01b0b841;
                        bVar79 = bVar79 & (byte)uVar26;
                        uVar74 = (ulong)bVar79;
                        auVar156._8_4_ = 0x7f800000;
                        auVar156._0_8_ = 0x7f8000007f800000;
                        auVar156._12_4_ = 0x7f800000;
                        auVar156._16_4_ = 0x7f800000;
                        auVar156._20_4_ = 0x7f800000;
                        auVar156._24_4_ = 0x7f800000;
                        auVar156._28_4_ = 0x7f800000;
                        auVar108 = vblendmps_avx512vl(auVar156,auVar211._0_32_);
                        auVar133._0_4_ =
                             (uint)(bVar79 & 1) * auVar108._0_4_ |
                             (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 1 & 1);
                        auVar133._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 2 & 1);
                        auVar133._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 3 & 1);
                        auVar133._12_4_ =
                             (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 4 & 1);
                        auVar133._16_4_ =
                             (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 5 & 1);
                        auVar133._20_4_ =
                             (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar79 >> 6 & 1);
                        auVar133._24_4_ =
                             (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar133._28_4_ =
                             (uint)(bVar79 >> 7) * auVar108._28_4_ |
                             (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
                        auVar108 = vshufps_avx(auVar133,auVar133,0xb1);
                        auVar108 = vminps_avx(auVar133,auVar108);
                        auVar109 = vshufpd_avx(auVar108,auVar108,5);
                        auVar108 = vminps_avx(auVar108,auVar109);
                        auVar109 = vpermpd_avx2(auVar108,0x4e);
                        auVar108 = vminps_avx(auVar108,auVar109);
                        uVar26 = vcmpps_avx512vl(auVar133,auVar108,0);
                        bVar69 = (byte)uVar26 & bVar79;
                        if (bVar69 != 0) {
                          bVar79 = bVar69;
                        }
                        uVar71 = 0;
                        for (uVar72 = (uint)bVar79; (uVar72 & 1) == 0;
                            uVar72 = uVar72 >> 1 | 0x80000000) {
                          uVar71 = uVar71 + 1;
                        }
                        uVar70 = (ulong)uVar71;
                      } while( true );
                    }
                    fVar165 = local_2e0[uVar70];
                    uVar144 = *(undefined4 *)(local_2c0 + uVar70 * 4);
                    fVar160 = 1.0 - fVar165;
                    fVar159 = fVar160 * fVar160 * -3.0;
                    auVar194 = ZEXT464((uint)fVar159);
                    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),
                                              ZEXT416((uint)(fVar165 * fVar160)),ZEXT416(0xc0000000)
                                             );
                    auVar90 = vfmsub132ss_fma(ZEXT416((uint)(fVar165 * fVar160)),
                                              ZEXT416((uint)(fVar165 * fVar165)),ZEXT416(0x40000000)
                                             );
                    fVar160 = auVar83._0_4_ * 3.0;
                    fVar161 = auVar90._0_4_ * 3.0;
                    fVar174 = fVar165 * fVar165 * 3.0;
                    auVar197._0_4_ = fVar174 * local_6c0;
                    auVar197._4_4_ = fVar174 * fStack_6bc;
                    auVar197._8_4_ = fVar174 * fStack_6b8;
                    auVar197._12_4_ = fVar174 * fStack_6b4;
                    auVar204 = ZEXT1664(auVar197);
                    auVar170._4_4_ = fVar161;
                    auVar170._0_4_ = fVar161;
                    auVar170._8_4_ = fVar161;
                    auVar170._12_4_ = fVar161;
                    auVar83 = vfmadd132ps_fma(auVar170,auVar197,auVar21);
                    auVar180._4_4_ = fVar160;
                    auVar180._0_4_ = fVar160;
                    auVar180._8_4_ = fVar160;
                    auVar180._12_4_ = fVar160;
                    auVar83 = vfmadd132ps_fma(auVar180,auVar83,auVar22);
                    auVar171._4_4_ = fVar159;
                    auVar171._0_4_ = fVar159;
                    auVar171._8_4_ = fVar159;
                    auVar171._12_4_ = fVar159;
                    auVar83 = vfmadd213ps_fma(auVar171,auVar82,auVar83);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar70 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar83._0_4_;
                    uVar10 = vextractps_avx(auVar83,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                    uVar10 = vextractps_avx(auVar83,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar165;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar144;
                    *(uint *)(ray + k * 4 + 0x220) = uVar9;
                    *(uint *)(ray + k * 4 + 0x240) = uVar75;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01b0b474;
      }
LAB_01b0ab20:
      uVar144 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar30._4_4_ = uVar144;
      auVar30._0_4_ = uVar144;
      auVar30._8_4_ = uVar144;
      auVar30._12_4_ = uVar144;
      uVar25 = vcmpps_avx512vl(local_270,auVar30,2);
      uVar75 = (uint)uVar78 & (uint)uVar25;
      uVar78 = (ulong)uVar75;
    } while (uVar75 != 0);
  }
  return;
LAB_01b0b841:
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar227 = ZEXT1664(auVar83);
  auVar228 = ZEXT3264(local_560);
  auVar229 = ZEXT3264(local_580);
  auVar108 = vmovdqa64_avx512vl(local_100);
  auVar226 = ZEXT3264(auVar108);
  uVar78 = local_608;
  iVar73 = local_5c0._0_4_;
LAB_01b0b474:
  lVar76 = lVar76 + 8;
  if (iVar73 <= (int)lVar76) goto LAB_01b0ab20;
  goto LAB_01b0abc5;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }